

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<4,_8,_1,_true,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKPluecker<4,_8,_true>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *pGVar5;
  RTCRayQueryContext *pRVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  size_t k;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  float fVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [28];
  bool bVar76;
  int iVar77;
  long lVar78;
  long lVar79;
  undefined1 (*pauVar80) [32];
  ulong uVar81;
  ulong uVar82;
  uint uVar83;
  undefined4 uVar84;
  ulong unaff_R12;
  NodeRef root;
  long lVar85;
  ulong *puVar86;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar104 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar114;
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  float fVar124;
  float fVar125;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 in_ZMM2 [64];
  undefined1 auVar123 [64];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  undefined1 auVar149 [64];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [64];
  undefined1 auVar156 [64];
  undefined1 auVar158 [32];
  undefined1 auVar157 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float fVar162;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar171;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar172 [64];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  Precalculations pre;
  RTCFilterFunctionNArguments args;
  vbool<8> terminated;
  vfloat<8> t;
  vfloat<8> v;
  vfloat<8> u;
  Vec3vf<8> Ng;
  TravRayK<8,_true> tray;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  Precalculations local_2eb1;
  RTCFilterFunctionNArguments local_2eb0;
  undefined1 local_2e80 [32];
  undefined1 local_2e60 [32];
  RayK<8> *local_2e28;
  undefined1 local_2e20 [8];
  undefined4 uStack_2e18;
  undefined4 uStack_2e14;
  undefined4 uStack_2e10;
  undefined4 uStack_2e0c;
  undefined4 uStack_2e08;
  undefined4 uStack_2e04;
  undefined1 local_2e00 [32];
  undefined1 (*local_2dc8) [32];
  undefined1 local_2dc0 [8];
  float fStack_2db8;
  float fStack_2db4;
  float fStack_2db0;
  float fStack_2dac;
  float fStack_2da8;
  undefined1 local_2da0 [12];
  undefined4 uStack_2d94;
  undefined4 uStack_2d90;
  undefined4 uStack_2d8c;
  undefined4 uStack_2d88;
  undefined4 uStack_2d84;
  undefined1 local_2d80 [32];
  BVH *local_2d60;
  Intersectors *local_2d58;
  long local_2d50;
  long local_2d48;
  undefined1 local_2d40 [32];
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  undefined1 local_2ce0 [32];
  undefined8 local_2cb0;
  undefined8 uStack_2ca8;
  undefined1 local_2ca0 [32];
  undefined1 local_2c80 [32];
  undefined1 local_2c60 [32];
  undefined1 local_2c40 [32];
  undefined1 local_2c20 [8];
  float fStack_2c18;
  float fStack_2c14;
  float fStack_2c10;
  float fStack_2c0c;
  float fStack_2c08;
  undefined1 local_2c00 [32];
  undefined1 local_2be0 [32];
  undefined1 local_2bc0 [32];
  undefined1 local_2ba0 [32];
  undefined1 local_2b80 [32];
  undefined1 local_2b60 [32];
  anon_union_32_3_4e90abd3_for_vfloat_impl<8>_1 local_2b40;
  RTCRayQueryContext local_2b20 [4];
  RTCRayN local_2b00 [32];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2ae0;
  undefined1 local_2a80 [32];
  undefined1 local_2a60 [32];
  undefined1 local_2a40 [32];
  uint local_2a20;
  uint uStack_2a1c;
  uint uStack_2a18;
  uint uStack_2a14;
  uint uStack_2a10;
  uint uStack_2a0c;
  uint uStack_2a08;
  uint uStack_2a04;
  uint local_2a00;
  uint uStack_29fc;
  uint uStack_29f8;
  uint uStack_29f4;
  uint uStack_29f0;
  uint uStack_29ec;
  uint uStack_29e8;
  uint uStack_29e4;
  uint local_29e0;
  uint uStack_29dc;
  uint uStack_29d8;
  uint uStack_29d4;
  uint uStack_29d0;
  uint uStack_29cc;
  uint uStack_29c8;
  uint uStack_29c4;
  int local_29c0 [24];
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_2960;
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [8];
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  undefined1 local_2880 [32];
  undefined1 local_2860 [8];
  float fStack_2858;
  float fStack_2854;
  float fStack_2850;
  float fStack_284c;
  float fStack_2848;
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 local_27e0 [32];
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined1 local_2740 [32];
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined4 local_2680;
  undefined4 uStack_267c;
  undefined4 uStack_2678;
  undefined4 uStack_2674;
  undefined4 uStack_2670;
  undefined4 uStack_266c;
  undefined4 uStack_2668;
  undefined4 uStack_2664;
  undefined4 local_2660;
  undefined4 uStack_265c;
  undefined4 uStack_2658;
  undefined4 uStack_2654;
  undefined4 uStack_2650;
  undefined4 uStack_264c;
  undefined4 uStack_2648;
  undefined4 uStack_2644;
  undefined4 local_2640;
  undefined4 uStack_263c;
  undefined4 uStack_2638;
  undefined4 uStack_2634;
  undefined4 uStack_2630;
  undefined4 uStack_262c;
  undefined4 uStack_2628;
  undefined4 uStack_2624;
  undefined8 local_2610;
  size_t local_2608;
  ulong local_2600 [240];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar142 [64];
  
  local_2d60 = (BVH *)This->ptr;
  local_2608 = (local_2d60->root).ptr;
  if (local_2608 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar117 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar104 = ZEXT816(0) << 0x40;
      auVar136 = vpcmpeqd_avx2(auVar117,(undefined1  [32])valid_i->field_0);
      auVar117 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar104),5);
      auVar105 = auVar136 & auVar117;
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0x7f,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar105 >> 0xbf,0) != '\0') ||
          (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar105[0x1f] < '\0') {
        auVar117 = vandps_avx(auVar117,auVar136);
        auVar19 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar123 = ZEXT1664(auVar19);
        local_2960._0_8_ = *(undefined8 *)ray;
        local_2960._8_8_ = *(undefined8 *)(ray + 8);
        local_2960._16_8_ = *(undefined8 *)(ray + 0x10);
        local_2960._24_8_ = *(undefined8 *)(ray + 0x18);
        local_2960._32_8_ = *(undefined8 *)(ray + 0x20);
        local_2960._40_8_ = *(undefined8 *)(ray + 0x28);
        local_2960._48_8_ = *(undefined8 *)(ray + 0x30);
        local_2960._56_8_ = *(undefined8 *)(ray + 0x38);
        local_2960._64_8_ = *(undefined8 *)(ray + 0x40);
        local_2960._72_8_ = *(undefined8 *)(ray + 0x48);
        local_2960._80_8_ = *(undefined8 *)(ray + 0x50);
        local_2960._88_8_ = *(undefined8 *)(ray + 0x58);
        local_2900 = *(undefined1 (*) [32])(ray + 0x80);
        local_28e0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_2b60._8_4_ = 0x7fffffff;
        local_2b60._0_8_ = 0x7fffffff7fffffff;
        local_2b60._12_4_ = 0x7fffffff;
        local_2b60._16_4_ = 0x7fffffff;
        local_2b60._20_4_ = 0x7fffffff;
        local_2b60._24_4_ = 0x7fffffff;
        local_2b60._28_4_ = 0x7fffffff;
        auVar157._8_4_ = 0x219392ef;
        auVar157._0_8_ = 0x219392ef219392ef;
        auVar157._12_4_ = 0x219392ef;
        auVar157._16_4_ = 0x219392ef;
        auVar157._20_4_ = 0x219392ef;
        auVar157._24_4_ = 0x219392ef;
        auVar157._28_4_ = 0x219392ef;
        auVar160._8_4_ = 0x3f800000;
        auVar160._0_8_ = 0x3f8000003f800000;
        auVar160._12_4_ = 0x3f800000;
        auVar160._16_4_ = 0x3f800000;
        auVar160._20_4_ = 0x3f800000;
        auVar160._24_4_ = 0x3f800000;
        auVar160._28_4_ = 0x3f800000;
        local_28c0 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar118 = vdivps_avx(auVar160,local_2900);
        auVar117 = vandps_avx(local_2b60,local_2900);
        auVar105 = vcmpps_avx(auVar117,auVar157,1);
        auVar117 = vandps_avx(local_2b60,local_28e0);
        auVar136 = vcmpps_avx(auVar117,auVar157,1);
        auVar148 = ZEXT3264(auVar136);
        auVar96 = vdivps_avx(auVar160,local_28e0);
        auVar117 = vandps_avx(local_2b60,local_28c0);
        auVar138._8_4_ = 0x5d5e0b6b;
        auVar138._0_8_ = 0x5d5e0b6b5d5e0b6b;
        auVar138._12_4_ = 0x5d5e0b6b;
        auVar138._16_4_ = 0x5d5e0b6b;
        auVar138._20_4_ = 0x5d5e0b6b;
        auVar138._24_4_ = 0x5d5e0b6b;
        auVar138._28_4_ = 0x5d5e0b6b;
        auVar155 = ZEXT3264(auVar138);
        _local_28a0 = vblendvps_avx(auVar118,auVar138,auVar105);
        auVar117 = vcmpps_avx(auVar117,auVar157,1);
        auVar105 = vdivps_avx(auVar160,local_28c0);
        local_2880 = vblendvps_avx(auVar96,auVar138,auVar136);
        _local_2860 = vblendvps_avx(auVar105,auVar138,auVar117);
        auVar117 = vcmpps_avx(_local_28a0,ZEXT1632(auVar104),1);
        auVar96._8_4_ = 0x10;
        auVar96._0_8_ = 0x1000000010;
        auVar96._12_4_ = 0x10;
        auVar96._16_4_ = 0x10;
        auVar96._20_4_ = 0x10;
        auVar96._24_4_ = 0x10;
        auVar96._28_4_ = 0x10;
        local_2840 = vandps_avx(auVar117,auVar96);
        auVar105 = ZEXT1632(auVar104);
        auVar117 = vcmpps_avx(local_2880,auVar105,5);
        auVar136._8_4_ = 0x20;
        auVar136._0_8_ = 0x2000000020;
        auVar136._12_4_ = 0x20;
        auVar136._16_4_ = 0x20;
        auVar136._20_4_ = 0x20;
        auVar136._24_4_ = 0x20;
        auVar136._28_4_ = 0x20;
        auVar140._8_4_ = 0x30;
        auVar140._0_8_ = 0x3000000030;
        auVar140._12_4_ = 0x30;
        auVar140._16_4_ = 0x30;
        auVar140._20_4_ = 0x30;
        auVar140._24_4_ = 0x30;
        auVar140._28_4_ = 0x30;
        local_2820 = vblendvps_avx(auVar140,auVar136,auVar117);
        auVar117 = vcmpps_avx(_local_2860,auVar105,5);
        auVar118._8_4_ = 0x40;
        auVar118._0_8_ = 0x4000000040;
        auVar118._12_4_ = 0x40;
        auVar118._16_4_ = 0x40;
        auVar118._20_4_ = 0x40;
        auVar118._24_4_ = 0x40;
        auVar118._28_4_ = 0x40;
        auVar141._8_4_ = 0x50;
        auVar141._0_8_ = 0x5000000050;
        auVar141._12_4_ = 0x50;
        auVar141._16_4_ = 0x50;
        auVar141._20_4_ = 0x50;
        auVar141._24_4_ = 0x50;
        auVar141._28_4_ = 0x50;
        auVar142 = ZEXT3264(auVar141);
        local_2800 = vblendvps_avx(auVar141,auVar118,auVar117);
        auVar117 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar105);
        local_27a0 = vpmovsxwd_avx2(auVar19);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar159 = ZEXT3264(local_1e80);
        local_27e0 = vblendvps_avx(local_1e80,auVar117,local_27a0);
        auVar117 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar105);
        auVar105._8_4_ = 0xff800000;
        auVar105._0_8_ = 0xff800000ff800000;
        auVar105._12_4_ = 0xff800000;
        auVar105._16_4_ = 0xff800000;
        auVar105._20_4_ = 0xff800000;
        auVar105._24_4_ = 0xff800000;
        auVar105._28_4_ = 0xff800000;
        local_27c0 = vblendvps_avx(auVar105,auVar117,local_27a0);
        auVar104 = vpcmpeqd_avx(local_27c0._0_16_,local_27c0._0_16_);
        local_2d20 = vpmovsxwd_avx2(auVar19 ^ auVar104);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar83 = 5;
        }
        else {
          uVar83 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 3 + 2;
        }
        local_2e28 = ray + 0x100;
        puVar86 = local_2600;
        local_2610 = 0xfffffffffffffff8;
        pauVar80 = (undefined1 (*) [32])local_1e40;
        local_1e60 = local_27e0;
        local_2760 = mm_lookupmask_ps._16_8_;
        uStack_2758 = mm_lookupmask_ps._24_8_;
        uStack_2750 = mm_lookupmask_ps._16_8_;
        uStack_2748 = mm_lookupmask_ps._24_8_;
        local_2dc8 = (undefined1 (*) [32])&local_2a00;
        local_2780 = mm_lookupmask_pd._0_8_;
        uStack_2778 = mm_lookupmask_pd._8_8_;
        uStack_2770 = mm_lookupmask_pd._0_8_;
        uStack_2768 = mm_lookupmask_pd._8_8_;
        auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        local_2d58 = This;
LAB_015c327d:
        do {
          do {
            root.ptr = puVar86[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_015c4887;
            puVar86 = puVar86 + -1;
            pauVar80 = pauVar80 + -1;
            auVar117 = *pauVar80;
            auVar180 = ZEXT3264(auVar117);
            auVar105 = vcmpps_avx(auVar117,local_27c0,1);
          } while ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar105 >> 0x7f,0) == '\0') &&
                     (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar105 >> 0xbf,0) == '\0') &&
                   (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar105[0x1f]);
          uVar84 = vmovmskps_avx(auVar105);
          unaff_R12 = CONCAT44((int)(unaff_R12 >> 0x20),uVar84);
          if (uVar83 < (uint)POPCOUNT(uVar84)) {
LAB_015c32ba:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_015c4887;
                auVar117 = vcmpps_avx(local_27c0,auVar180._0_32_,6);
                if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar117 >> 0x7f,0) == '\0') &&
                      (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar117 >> 0xbf,0) == '\0') &&
                    (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar117[0x1f]) goto LAB_015c327d;
                lVar79 = (ulong)((uint)root.ptr & 0xf) - 8;
                auVar117 = vpcmpeqd_avx2(auVar117,auVar117);
                local_2ca0 = auVar117 ^ local_2d20;
                unaff_R12 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                lVar78 = 0;
                goto LAB_015c34a2;
              }
              uVar82 = 8;
              auVar117 = auVar159._0_32_;
              for (lVar79 = 0;
                  (auVar180 = ZEXT3264(auVar117), lVar79 != 4 &&
                  (uVar4 = *(ulong *)((root.ptr & 0xfffffffffffffff0) + lVar79 * 8), uVar4 != 8));
                  lVar79 = lVar79 + 1) {
                uVar84 = *(undefined4 *)(root.ptr + 0x20 + lVar79 * 4);
                auVar87._4_4_ = uVar84;
                auVar87._0_4_ = uVar84;
                auVar87._8_4_ = uVar84;
                auVar87._12_4_ = uVar84;
                auVar87._16_4_ = uVar84;
                auVar87._20_4_ = uVar84;
                auVar87._24_4_ = uVar84;
                auVar87._28_4_ = uVar84;
                auVar67._8_8_ = local_2960._8_8_;
                auVar67._0_8_ = local_2960._0_8_;
                auVar67._16_8_ = local_2960._16_8_;
                auVar67._24_8_ = local_2960._24_8_;
                auVar68._8_8_ = local_2960._40_8_;
                auVar68._0_8_ = local_2960._32_8_;
                auVar68._16_8_ = local_2960._48_8_;
                auVar68._24_8_ = local_2960._56_8_;
                auVar69._8_8_ = local_2960._72_8_;
                auVar69._0_8_ = local_2960._64_8_;
                auVar69._16_8_ = local_2960._80_8_;
                auVar69._24_8_ = local_2960._88_8_;
                auVar105 = vsubps_avx(auVar87,auVar67);
                auVar180._0_4_ = (float)local_28a0._0_4_ * auVar105._0_4_;
                auVar180._4_4_ = (float)local_28a0._4_4_ * auVar105._4_4_;
                auVar180._8_4_ = fStack_2898 * auVar105._8_4_;
                auVar180._12_4_ = fStack_2894 * auVar105._12_4_;
                auVar180._16_4_ = fStack_2890 * auVar105._16_4_;
                auVar180._20_4_ = fStack_288c * auVar105._20_4_;
                auVar180._28_36_ = auVar142._28_36_;
                auVar180._24_4_ = fStack_2888 * auVar105._24_4_;
                auVar118 = auVar180._0_32_;
                auVar142 = ZEXT3264(auVar118);
                uVar84 = *(undefined4 *)(root.ptr + 0x40 + lVar79 * 4);
                auVar88._4_4_ = uVar84;
                auVar88._0_4_ = uVar84;
                auVar88._8_4_ = uVar84;
                auVar88._12_4_ = uVar84;
                auVar88._16_4_ = uVar84;
                auVar88._20_4_ = uVar84;
                auVar88._24_4_ = uVar84;
                auVar88._28_4_ = uVar84;
                auVar105 = vsubps_avx(auVar88,auVar68);
                auVar149._0_4_ = local_2880._0_4_ * auVar105._0_4_;
                auVar149._4_4_ = local_2880._4_4_ * auVar105._4_4_;
                auVar149._8_4_ = local_2880._8_4_ * auVar105._8_4_;
                auVar149._12_4_ = local_2880._12_4_ * auVar105._12_4_;
                auVar149._16_4_ = local_2880._16_4_ * auVar105._16_4_;
                auVar149._20_4_ = local_2880._20_4_ * auVar105._20_4_;
                auVar149._28_36_ = auVar148._28_36_;
                auVar149._24_4_ = local_2880._24_4_ * auVar105._24_4_;
                auVar96 = auVar149._0_32_;
                auVar148 = ZEXT3264(auVar96);
                uVar84 = *(undefined4 *)(root.ptr + 0x60 + lVar79 * 4);
                auVar89._4_4_ = uVar84;
                auVar89._0_4_ = uVar84;
                auVar89._8_4_ = uVar84;
                auVar89._12_4_ = uVar84;
                auVar89._16_4_ = uVar84;
                auVar89._20_4_ = uVar84;
                auVar89._24_4_ = uVar84;
                auVar89._28_4_ = uVar84;
                auVar105 = vsubps_avx(auVar89,auVar69);
                auVar156._0_4_ = (float)local_2860._0_4_ * auVar105._0_4_;
                auVar156._4_4_ = (float)local_2860._4_4_ * auVar105._4_4_;
                auVar156._8_4_ = fStack_2858 * auVar105._8_4_;
                auVar156._12_4_ = fStack_2854 * auVar105._12_4_;
                auVar156._16_4_ = fStack_2850 * auVar105._16_4_;
                auVar156._20_4_ = fStack_284c * auVar105._20_4_;
                auVar156._28_36_ = auVar155._28_36_;
                auVar156._24_4_ = fStack_2848 * auVar105._24_4_;
                auVar140 = auVar156._0_32_;
                auVar155 = ZEXT3264(auVar140);
                uVar84 = *(undefined4 *)(root.ptr + 0x30 + lVar79 * 4);
                auVar90._4_4_ = uVar84;
                auVar90._0_4_ = uVar84;
                auVar90._8_4_ = uVar84;
                auVar90._12_4_ = uVar84;
                auVar90._16_4_ = uVar84;
                auVar90._20_4_ = uVar84;
                auVar90._24_4_ = uVar84;
                auVar90._28_4_ = uVar84;
                auVar105 = vsubps_avx(auVar90,auVar67);
                auVar24._4_4_ = (float)local_28a0._4_4_ * auVar105._4_4_;
                auVar24._0_4_ = (float)local_28a0._0_4_ * auVar105._0_4_;
                auVar24._8_4_ = fStack_2898 * auVar105._8_4_;
                auVar24._12_4_ = fStack_2894 * auVar105._12_4_;
                auVar24._16_4_ = fStack_2890 * auVar105._16_4_;
                auVar24._20_4_ = fStack_288c * auVar105._20_4_;
                auVar24._24_4_ = fStack_2888 * auVar105._24_4_;
                auVar24._28_4_ = (int)((ulong)local_2960._24_8_ >> 0x20);
                uVar84 = *(undefined4 *)(root.ptr + 0x50 + lVar79 * 4);
                auVar91._4_4_ = uVar84;
                auVar91._0_4_ = uVar84;
                auVar91._8_4_ = uVar84;
                auVar91._12_4_ = uVar84;
                auVar91._16_4_ = uVar84;
                auVar91._20_4_ = uVar84;
                auVar91._24_4_ = uVar84;
                auVar91._28_4_ = uVar84;
                auVar105 = vsubps_avx(auVar91,auVar68);
                auVar25._4_4_ = local_2880._4_4_ * auVar105._4_4_;
                auVar25._0_4_ = local_2880._0_4_ * auVar105._0_4_;
                auVar25._8_4_ = local_2880._8_4_ * auVar105._8_4_;
                auVar25._12_4_ = local_2880._12_4_ * auVar105._12_4_;
                auVar25._16_4_ = local_2880._16_4_ * auVar105._16_4_;
                auVar25._20_4_ = local_2880._20_4_ * auVar105._20_4_;
                auVar25._24_4_ = local_2880._24_4_ * auVar105._24_4_;
                auVar25._28_4_ = (int)((ulong)local_2960._56_8_ >> 0x20);
                uVar84 = *(undefined4 *)(root.ptr + 0x70 + lVar79 * 4);
                auVar92._4_4_ = uVar84;
                auVar92._0_4_ = uVar84;
                auVar92._8_4_ = uVar84;
                auVar92._12_4_ = uVar84;
                auVar92._16_4_ = uVar84;
                auVar92._20_4_ = uVar84;
                auVar92._24_4_ = uVar84;
                auVar92._28_4_ = uVar84;
                auVar105 = vsubps_avx(auVar92,auVar69);
                auVar26._4_4_ = (float)local_2860._4_4_ * auVar105._4_4_;
                auVar26._0_4_ = (float)local_2860._0_4_ * auVar105._0_4_;
                auVar26._8_4_ = fStack_2858 * auVar105._8_4_;
                auVar26._12_4_ = fStack_2854 * auVar105._12_4_;
                auVar26._16_4_ = fStack_2850 * auVar105._16_4_;
                auVar26._20_4_ = fStack_284c * auVar105._20_4_;
                auVar26._24_4_ = fStack_2848 * auVar105._24_4_;
                auVar26._28_4_ = (int)((ulong)local_2960._88_8_ >> 0x20);
                auVar105 = vminps_avx(auVar118,auVar24);
                auVar136 = vminps_avx(auVar96,auVar25);
                auVar105 = vmaxps_avx(auVar105,auVar136);
                auVar136 = vminps_avx(auVar140,auVar26);
                auVar105 = vmaxps_avx(auVar105,auVar136);
                auVar27._4_4_ = auVar161._4_4_ * auVar105._4_4_;
                auVar27._0_4_ = auVar161._0_4_ * auVar105._0_4_;
                auVar27._8_4_ = auVar161._8_4_ * auVar105._8_4_;
                auVar27._12_4_ = auVar161._12_4_ * auVar105._12_4_;
                auVar27._16_4_ = auVar161._16_4_ * auVar105._16_4_;
                auVar27._20_4_ = auVar161._20_4_ * auVar105._20_4_;
                auVar27._24_4_ = auVar161._24_4_ * auVar105._24_4_;
                auVar27._28_4_ = auVar105._28_4_;
                auVar105 = vmaxps_avx(auVar118,auVar24);
                auVar136 = vmaxps_avx(auVar96,auVar25);
                auVar136 = vminps_avx(auVar105,auVar136);
                auVar105 = vmaxps_avx(auVar140,auVar26);
                auVar105 = vminps_avx(auVar136,auVar105);
                auVar28._4_4_ = auVar172._4_4_ * auVar105._4_4_;
                auVar28._0_4_ = auVar172._0_4_ * auVar105._0_4_;
                auVar28._8_4_ = auVar172._8_4_ * auVar105._8_4_;
                auVar28._12_4_ = auVar172._12_4_ * auVar105._12_4_;
                auVar28._16_4_ = auVar172._16_4_ * auVar105._16_4_;
                auVar28._20_4_ = auVar172._20_4_ * auVar105._20_4_;
                auVar28._24_4_ = auVar172._24_4_ * auVar105._24_4_;
                auVar28._28_4_ = auVar105._28_4_;
                auVar105 = vmaxps_avx(auVar27,local_27e0);
                auVar123 = ZEXT3264(auVar105);
                auVar136 = vminps_avx(auVar28,local_27c0);
                auVar136 = vcmpps_avx(auVar105,auVar136,2);
                uVar81 = uVar82;
                auVar105 = auVar117;
                if (((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar136 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar136 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar136 >> 0x7f,0) != '\0') ||
                       (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar136 >> 0xbf,0) != '\0') ||
                     (auVar136 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar136[0x1f] < '\0') &&
                   (auVar105 = vblendvps_avx(auVar159._0_32_,auVar27,auVar136), uVar81 = uVar4,
                   uVar82 != 8)) {
                  *puVar86 = uVar82;
                  puVar86 = puVar86 + 1;
                  *pauVar80 = auVar117;
                  pauVar80 = pauVar80 + 1;
                }
                auVar117 = auVar105;
                uVar82 = uVar81;
              }
              if (uVar82 == 8) goto LAB_015c3436;
              auVar105 = vcmpps_avx(local_27c0,auVar117,6);
              uVar84 = vmovmskps_avx(auVar105);
              root.ptr = uVar82;
            } while ((byte)uVar83 < (byte)POPCOUNT(uVar84));
            *puVar86 = uVar82;
            puVar86 = puVar86 + 1;
            *pauVar80 = auVar117;
            pauVar80 = pauVar80 + 1;
LAB_015c3436:
            iVar77 = 4;
          }
          else {
            while (local_2e00 = auVar117, unaff_R12 != 0) {
              k = 0;
              for (uVar82 = unaff_R12; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000)
              {
                k = k + 1;
              }
              unaff_R12 = unaff_R12 - 1 & unaff_R12;
              local_2e60._0_8_ = k;
              auVar123 = ZEXT1664(auVar123._0_16_);
              auVar142 = ZEXT1664(auVar142._0_16_);
              auVar148 = ZEXT1664(auVar148._0_16_);
              auVar155 = ZEXT1664(auVar155._0_16_);
              bVar76 = occluded1(local_2d58,local_2d60,root,k,&local_2eb1,ray,
                                 (TravRayK<8,_true> *)&local_2960.field_0,context);
              auVar117 = local_2e00;
              if (bVar76) {
                *(undefined4 *)(local_2d20 + local_2e60._0_8_ * 4) = 0xffffffff;
              }
            }
            auVar117 = _DAT_01f7b020 & ~local_2d20;
            iVar77 = 3;
            auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            auVar180 = ZEXT3264(local_2e00);
            if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar117 >> 0x7f,0) != '\0') ||
                  (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar117 >> 0xbf,0) != '\0') ||
                (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar117[0x1f] < '\0') {
              auVar117._8_4_ = 0xff800000;
              auVar117._0_8_ = 0xff800000ff800000;
              auVar117._12_4_ = 0xff800000;
              auVar117._16_4_ = 0xff800000;
              auVar117._20_4_ = 0xff800000;
              auVar117._24_4_ = 0xff800000;
              auVar117._28_4_ = 0xff800000;
              auVar123 = ZEXT3264(auVar117);
              local_27c0 = vblendvps_avx(local_27c0,auVar117,local_2d20);
              iVar77 = 2;
            }
            unaff_R12 = 0;
            if (uVar83 < (uint)POPCOUNT(uVar84)) goto LAB_015c32ba;
          }
        } while (iVar77 != 3);
LAB_015c4887:
        auVar117 = vandps_avx(local_27a0,local_2d20);
        auVar113._8_4_ = 0xff800000;
        auVar113._0_8_ = 0xff800000ff800000;
        auVar113._12_4_ = 0xff800000;
        auVar113._16_4_ = 0xff800000;
        auVar113._20_4_ = 0xff800000;
        auVar113._24_4_ = 0xff800000;
        auVar113._28_4_ = 0xff800000;
        auVar117 = vmaskmovps_avx(auVar117,auVar113);
        *(undefined1 (*) [32])local_2e28 = auVar117;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
LAB_015c34a2:
  do {
    auVar117 = auVar123._0_32_;
    if (lVar78 == lVar79) break;
    local_2d48 = lVar78 * 0xe0 + (root.ptr & 0xfffffffffffffff0);
    local_2e00._0_8_ = unaff_R12;
    local_2d50 = lVar78;
    auVar105 = local_2ca0;
    for (lVar85 = 0; lVar85 != 4; lVar85 = lVar85 + 1) {
      uVar82 = CONCAT44(0,*(uint *)(unaff_R12 + lVar85 * 4));
      local_2dc0 = (undefined1  [8])uVar82;
      if (uVar82 == 0xffffffff) break;
      uVar84 = *(undefined4 *)((unaff_R12 - 0xc0) + lVar85 * 4);
      auVar93._4_4_ = uVar84;
      auVar93._0_4_ = uVar84;
      auVar93._8_4_ = uVar84;
      auVar93._12_4_ = uVar84;
      auVar93._16_4_ = uVar84;
      auVar93._20_4_ = uVar84;
      auVar93._24_4_ = uVar84;
      auVar93._28_4_ = uVar84;
      uVar84 = *(undefined4 *)((unaff_R12 - 0xb0) + lVar85 * 4);
      auVar115._4_4_ = uVar84;
      auVar115._0_4_ = uVar84;
      auVar115._8_4_ = uVar84;
      auVar115._12_4_ = uVar84;
      auVar115._16_4_ = uVar84;
      auVar115._20_4_ = uVar84;
      auVar115._24_4_ = uVar84;
      auVar115._28_4_ = uVar84;
      uVar84 = *(undefined4 *)((unaff_R12 - 0xa0) + lVar85 * 4);
      auVar130._4_4_ = uVar84;
      auVar130._0_4_ = uVar84;
      auVar130._8_4_ = uVar84;
      auVar130._12_4_ = uVar84;
      auVar130._16_4_ = uVar84;
      auVar130._20_4_ = uVar84;
      auVar130._24_4_ = uVar84;
      auVar130._28_4_ = uVar84;
      local_2e20._4_4_ = *(undefined4 *)((unaff_R12 - 0x90) + lVar85 * 4);
      local_2e20._0_4_ = local_2e20._4_4_;
      uStack_2e18 = local_2e20._4_4_;
      uStack_2e14 = local_2e20._4_4_;
      uStack_2e10 = local_2e20._4_4_;
      uStack_2e0c = local_2e20._4_4_;
      uStack_2e08 = local_2e20._4_4_;
      uStack_2e04 = local_2e20._4_4_;
      uVar84 = *(undefined4 *)((unaff_R12 - 0x80) + lVar85 * 4);
      local_2c80._4_4_ = uVar84;
      local_2c80._0_4_ = uVar84;
      local_2c80._8_4_ = uVar84;
      local_2c80._12_4_ = uVar84;
      local_2c80._16_4_ = uVar84;
      local_2c80._20_4_ = uVar84;
      local_2c80._24_4_ = uVar84;
      local_2c80._28_4_ = uVar84;
      local_2da0._4_4_ = *(undefined4 *)((unaff_R12 - 0x70) + lVar85 * 4);
      local_2da0._0_4_ = local_2da0._4_4_;
      local_2da0._8_4_ = local_2da0._4_4_;
      uStack_2d94 = local_2da0._4_4_;
      uStack_2d90 = local_2da0._4_4_;
      uStack_2d8c = local_2da0._4_4_;
      uStack_2d88 = local_2da0._4_4_;
      uStack_2d84 = local_2da0._4_4_;
      local_2640 = *(undefined4 *)((unaff_R12 - 0x60) + lVar85 * 4);
      uStack_263c = local_2640;
      uStack_2638 = local_2640;
      uStack_2634 = local_2640;
      uStack_2630 = local_2640;
      uStack_262c = local_2640;
      uStack_2628 = local_2640;
      uStack_2624 = local_2640;
      local_2660 = *(undefined4 *)((unaff_R12 - 0x50) + lVar85 * 4);
      uStack_265c = local_2660;
      uStack_2658 = local_2660;
      uStack_2654 = local_2660;
      uStack_2650 = local_2660;
      uStack_264c = local_2660;
      uStack_2648 = local_2660;
      uStack_2644 = local_2660;
      local_2680 = *(undefined4 *)((unaff_R12 - 0x40) + lVar85 * 4);
      uStack_267c = local_2680;
      uStack_2678 = local_2680;
      uStack_2674 = local_2680;
      uStack_2670 = local_2680;
      uStack_266c = local_2680;
      uStack_2668 = local_2680;
      uStack_2664 = local_2680;
      uVar84 = *(undefined4 *)((unaff_R12 - 0x30) + lVar85 * 4);
      local_26a0._4_4_ = uVar84;
      local_26a0._0_4_ = uVar84;
      local_26a0._8_4_ = uVar84;
      local_26a0._12_4_ = uVar84;
      local_26a0._16_4_ = uVar84;
      local_26a0._20_4_ = uVar84;
      local_26a0._24_4_ = uVar84;
      local_26a0._28_4_ = uVar84;
      uVar84 = *(undefined4 *)((unaff_R12 - 0x20) + lVar85 * 4);
      local_26c0._4_4_ = uVar84;
      local_26c0._0_4_ = uVar84;
      local_26c0._8_4_ = uVar84;
      local_26c0._12_4_ = uVar84;
      local_26c0._16_4_ = uVar84;
      local_26c0._20_4_ = uVar84;
      local_26c0._24_4_ = uVar84;
      local_26c0._28_4_ = uVar84;
      uVar84 = *(undefined4 *)((unaff_R12 - 0x10) + lVar85 * 4);
      local_26e0._4_4_ = uVar84;
      local_26e0._0_4_ = uVar84;
      local_26e0._8_4_ = uVar84;
      local_26e0._12_4_ = uVar84;
      local_26e0._16_4_ = uVar84;
      local_26e0._20_4_ = uVar84;
      local_26e0._24_4_ = uVar84;
      local_26e0._28_4_ = uVar84;
      local_2cb0 = *(undefined8 *)(local_2d48 + 0xd0);
      uStack_2ca8 = *(undefined8 *)(local_2d48 + 0xd8);
      auVar117 = *(undefined1 (*) [32])ray;
      auVar136 = *(undefined1 (*) [32])(ray + 0x20);
      auVar118 = *(undefined1 (*) [32])(ray + 0x40);
      local_2d00 = vsubps_avx(auVar93,auVar117);
      local_2b80 = vsubps_avx(auVar115,auVar136);
      local_2ba0 = vsubps_avx(auVar130,auVar118);
      auVar96 = vsubps_avx(local_26c0,auVar136);
      auVar140 = vsubps_avx(local_26e0,auVar118);
      local_2be0 = vsubps_avx(auVar96,local_2b80);
      local_2bc0 = vsubps_avx(auVar140,local_2ba0);
      auVar154._0_4_ = auVar96._0_4_ + local_2b80._0_4_;
      auVar154._4_4_ = auVar96._4_4_ + local_2b80._4_4_;
      auVar154._8_4_ = auVar96._8_4_ + local_2b80._8_4_;
      auVar154._12_4_ = auVar96._12_4_ + local_2b80._12_4_;
      auVar154._16_4_ = auVar96._16_4_ + local_2b80._16_4_;
      auVar154._20_4_ = auVar96._20_4_ + local_2b80._20_4_;
      auVar154._24_4_ = auVar96._24_4_ + local_2b80._24_4_;
      auVar154._28_4_ = auVar96._28_4_ + local_2b80._28_4_;
      fVar8 = local_2ba0._0_4_;
      auVar163._0_4_ = auVar140._0_4_ + fVar8;
      fVar9 = local_2ba0._4_4_;
      auVar163._4_4_ = auVar140._4_4_ + fVar9;
      fVar10 = local_2ba0._8_4_;
      auVar163._8_4_ = auVar140._8_4_ + fVar10;
      fVar11 = local_2ba0._12_4_;
      auVar163._12_4_ = auVar140._12_4_ + fVar11;
      fVar12 = local_2ba0._16_4_;
      auVar163._16_4_ = auVar140._16_4_ + fVar12;
      fVar13 = local_2ba0._20_4_;
      auVar163._20_4_ = auVar140._20_4_ + fVar13;
      fVar14 = local_2ba0._24_4_;
      auVar163._24_4_ = auVar140._24_4_ + fVar14;
      fVar114 = local_2ba0._28_4_;
      auVar163._28_4_ = auVar140._28_4_ + fVar114;
      auVar123._0_4_ = auVar154._0_4_ * local_2bc0._0_4_;
      auVar123._4_4_ = auVar154._4_4_ * local_2bc0._4_4_;
      auVar123._8_4_ = auVar154._8_4_ * local_2bc0._8_4_;
      auVar123._12_4_ = auVar154._12_4_ * local_2bc0._12_4_;
      auVar123._16_4_ = auVar154._16_4_ * local_2bc0._16_4_;
      auVar123._20_4_ = auVar154._20_4_ * local_2bc0._20_4_;
      auVar123._28_36_ = auVar172._28_36_;
      auVar123._24_4_ = auVar154._24_4_ * local_2bc0._24_4_;
      auVar19 = vfmsub231ps_fma(auVar123._0_32_,local_2be0,auVar163);
      auVar141 = vsubps_avx(local_26a0,auVar117);
      local_2c00 = vsubps_avx(auVar141,local_2d00);
      auVar20._4_4_ = auVar163._4_4_ * local_2c00._4_4_;
      auVar20._0_4_ = auVar163._0_4_ * local_2c00._0_4_;
      auVar20._8_4_ = auVar163._8_4_ * local_2c00._8_4_;
      auVar20._12_4_ = auVar163._12_4_ * local_2c00._12_4_;
      auVar20._16_4_ = auVar163._16_4_ * local_2c00._16_4_;
      auVar20._20_4_ = auVar163._20_4_ * local_2c00._20_4_;
      auVar20._24_4_ = auVar163._24_4_ * local_2c00._24_4_;
      auVar20._28_4_ = auVar163._28_4_;
      auVar179._0_4_ = auVar141._0_4_ + local_2d00._0_4_;
      auVar179._4_4_ = auVar141._4_4_ + local_2d00._4_4_;
      auVar179._8_4_ = auVar141._8_4_ + local_2d00._8_4_;
      auVar179._12_4_ = auVar141._12_4_ + local_2d00._12_4_;
      auVar179._16_4_ = auVar141._16_4_ + local_2d00._16_4_;
      auVar179._20_4_ = auVar141._20_4_ + local_2d00._20_4_;
      auVar179._24_4_ = auVar141._24_4_ + local_2d00._24_4_;
      auVar179._28_4_ = auVar141._28_4_ + local_2d00._28_4_;
      auVar104 = vfmsub231ps_fma(auVar20,local_2bc0,auVar179);
      auVar29._4_4_ = auVar179._4_4_ * local_2be0._4_4_;
      auVar29._0_4_ = auVar179._0_4_ * local_2be0._0_4_;
      auVar29._8_4_ = auVar179._8_4_ * local_2be0._8_4_;
      auVar29._12_4_ = auVar179._12_4_ * local_2be0._12_4_;
      auVar29._16_4_ = auVar179._16_4_ * local_2be0._16_4_;
      auVar29._20_4_ = auVar179._20_4_ * local_2be0._20_4_;
      auVar29._24_4_ = auVar179._24_4_ * local_2be0._24_4_;
      auVar29._28_4_ = auVar179._28_4_;
      auVar21 = vfmsub231ps_fma(auVar29,local_2c00,auVar154);
      pRVar1 = ray + 0xc0;
      fVar124 = *(float *)pRVar1;
      fVar125 = *(float *)(ray + 0xc4);
      fVar126 = *(float *)(ray + 200);
      fVar127 = *(float *)(ray + 0xcc);
      fVar128 = *(float *)(ray + 0xd0);
      fVar129 = *(float *)(ray + 0xd4);
      fVar66 = *(float *)(ray + 0xd8);
      auVar75 = *(undefined1 (*) [28])pRVar1;
      auVar30._4_4_ = auVar21._4_4_ * fVar125;
      auVar30._0_4_ = auVar21._0_4_ * fVar124;
      auVar30._8_4_ = auVar21._8_4_ * fVar126;
      auVar30._12_4_ = auVar21._12_4_ * fVar127;
      auVar30._16_4_ = fVar128 * 0.0;
      auVar30._20_4_ = fVar129 * 0.0;
      auVar30._24_4_ = fVar66 * 0.0;
      auVar30._28_4_ = auVar154._28_4_;
      local_2e80 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar104 = vfmadd231ps_fma(auVar30,local_2e80,ZEXT1632(auVar104));
      local_2ce0 = *(undefined1 (*) [32])(ray + 0x80);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),local_2ce0,ZEXT1632(auVar19));
      auVar155 = ZEXT1664(auVar104);
      auVar117 = vsubps_avx(_local_2e20,auVar117);
      auVar136 = vsubps_avx(local_2c80,auVar136);
      auVar138 = vsubps_avx(_local_2da0,auVar118);
      local_2c40 = vsubps_avx(local_2b80,auVar136);
      auVar157 = vsubps_avx(local_2ba0,auVar138);
      auVar137._0_4_ = local_2b80._0_4_ + auVar136._0_4_;
      auVar137._4_4_ = local_2b80._4_4_ + auVar136._4_4_;
      auVar137._8_4_ = local_2b80._8_4_ + auVar136._8_4_;
      auVar137._12_4_ = local_2b80._12_4_ + auVar136._12_4_;
      auVar137._16_4_ = local_2b80._16_4_ + auVar136._16_4_;
      auVar137._20_4_ = local_2b80._20_4_ + auVar136._20_4_;
      auVar137._24_4_ = local_2b80._24_4_ + auVar136._24_4_;
      auVar137._28_4_ = local_2b80._28_4_ + auVar136._28_4_;
      auVar145._0_4_ = fVar8 + auVar138._0_4_;
      auVar145._4_4_ = fVar9 + auVar138._4_4_;
      auVar145._8_4_ = fVar10 + auVar138._8_4_;
      auVar145._12_4_ = fVar11 + auVar138._12_4_;
      auVar145._16_4_ = fVar12 + auVar138._16_4_;
      auVar145._20_4_ = fVar13 + auVar138._20_4_;
      auVar145._24_4_ = fVar14 + auVar138._24_4_;
      auVar145._28_4_ = fVar114 + auVar138._28_4_;
      fVar171 = auVar157._0_4_;
      fVar173 = auVar157._4_4_;
      auVar31._4_4_ = fVar173 * auVar137._4_4_;
      auVar31._0_4_ = fVar171 * auVar137._0_4_;
      fVar174 = auVar157._8_4_;
      auVar31._8_4_ = fVar174 * auVar137._8_4_;
      fVar175 = auVar157._12_4_;
      auVar31._12_4_ = fVar175 * auVar137._12_4_;
      fVar176 = auVar157._16_4_;
      auVar31._16_4_ = fVar176 * auVar137._16_4_;
      fVar177 = auVar157._20_4_;
      auVar31._20_4_ = fVar177 * auVar137._20_4_;
      fVar178 = auVar157._24_4_;
      auVar31._24_4_ = fVar178 * auVar137._24_4_;
      auVar31._28_4_ = auVar118._28_4_;
      auVar21 = vfmsub231ps_fma(auVar31,local_2c40,auVar145);
      auVar118 = vsubps_avx(local_2d00,auVar117);
      fVar162 = auVar118._0_4_;
      fVar165 = auVar118._4_4_;
      auVar32._4_4_ = fVar165 * auVar145._4_4_;
      auVar32._0_4_ = fVar162 * auVar145._0_4_;
      fVar166 = auVar118._8_4_;
      auVar32._8_4_ = fVar166 * auVar145._8_4_;
      fVar167 = auVar118._12_4_;
      auVar32._12_4_ = fVar167 * auVar145._12_4_;
      fVar168 = auVar118._16_4_;
      auVar32._16_4_ = fVar168 * auVar145._16_4_;
      fVar169 = auVar118._20_4_;
      auVar32._20_4_ = fVar169 * auVar145._20_4_;
      fVar170 = auVar118._24_4_;
      auVar32._24_4_ = fVar170 * auVar145._24_4_;
      auVar32._28_4_ = auVar145._28_4_;
      auVar143._0_4_ = local_2d00._0_4_ + auVar117._0_4_;
      auVar143._4_4_ = local_2d00._4_4_ + auVar117._4_4_;
      auVar143._8_4_ = local_2d00._8_4_ + auVar117._8_4_;
      auVar143._12_4_ = local_2d00._12_4_ + auVar117._12_4_;
      auVar143._16_4_ = local_2d00._16_4_ + auVar117._16_4_;
      auVar143._20_4_ = local_2d00._20_4_ + auVar117._20_4_;
      auVar143._24_4_ = local_2d00._24_4_ + auVar117._24_4_;
      auVar143._28_4_ = local_2d00._28_4_ + auVar117._28_4_;
      auVar19 = vfmsub231ps_fma(auVar32,auVar157,auVar143);
      fVar101 = local_2c40._0_4_;
      fVar102 = local_2c40._4_4_;
      auVar33._4_4_ = auVar143._4_4_ * fVar102;
      auVar33._0_4_ = auVar143._0_4_ * fVar101;
      fVar103 = local_2c40._8_4_;
      auVar33._8_4_ = auVar143._8_4_ * fVar103;
      fVar15 = local_2c40._12_4_;
      auVar33._12_4_ = auVar143._12_4_ * fVar15;
      fVar16 = local_2c40._16_4_;
      auVar33._16_4_ = auVar143._16_4_ * fVar16;
      fVar17 = local_2c40._20_4_;
      auVar33._20_4_ = auVar143._20_4_ * fVar17;
      fVar18 = local_2c40._24_4_;
      auVar33._24_4_ = auVar143._24_4_ * fVar18;
      auVar33._28_4_ = auVar143._28_4_;
      auVar22 = vfmsub231ps_fma(auVar33,auVar118,auVar137);
      auVar144._0_4_ = fVar124 * auVar22._0_4_;
      auVar144._4_4_ = fVar125 * auVar22._4_4_;
      auVar144._8_4_ = fVar126 * auVar22._8_4_;
      auVar144._12_4_ = fVar127 * auVar22._12_4_;
      auVar144._16_4_ = fVar128 * 0.0;
      auVar144._20_4_ = fVar129 * 0.0;
      auVar144._24_4_ = fVar66 * 0.0;
      auVar144._28_4_ = 0;
      auVar19 = vfmadd231ps_fma(auVar144,local_2e80,ZEXT1632(auVar19));
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_2ce0,ZEXT1632(auVar21));
      auVar160 = vsubps_avx(auVar117,auVar141);
      auVar94._0_4_ = auVar141._0_4_ + auVar117._0_4_;
      auVar94._4_4_ = auVar141._4_4_ + auVar117._4_4_;
      auVar94._8_4_ = auVar141._8_4_ + auVar117._8_4_;
      auVar94._12_4_ = auVar141._12_4_ + auVar117._12_4_;
      auVar94._16_4_ = auVar141._16_4_ + auVar117._16_4_;
      auVar94._20_4_ = auVar141._20_4_ + auVar117._20_4_;
      auVar94._24_4_ = auVar141._24_4_ + auVar117._24_4_;
      auVar94._28_4_ = auVar141._28_4_ + auVar117._28_4_;
      auVar141 = vsubps_avx(auVar136,auVar96);
      auVar148 = ZEXT3264(auVar141);
      auVar106._0_4_ = auVar136._0_4_ + auVar96._0_4_;
      auVar106._4_4_ = auVar136._4_4_ + auVar96._4_4_;
      auVar106._8_4_ = auVar136._8_4_ + auVar96._8_4_;
      auVar106._12_4_ = auVar136._12_4_ + auVar96._12_4_;
      auVar106._16_4_ = auVar136._16_4_ + auVar96._16_4_;
      auVar106._20_4_ = auVar136._20_4_ + auVar96._20_4_;
      auVar106._24_4_ = auVar136._24_4_ + auVar96._24_4_;
      auVar106._28_4_ = auVar136._28_4_ + auVar96._28_4_;
      auVar96 = vsubps_avx(auVar138,auVar140);
      auVar116._0_4_ = auVar138._0_4_ + auVar140._0_4_;
      auVar116._4_4_ = auVar138._4_4_ + auVar140._4_4_;
      auVar116._8_4_ = auVar138._8_4_ + auVar140._8_4_;
      auVar116._12_4_ = auVar138._12_4_ + auVar140._12_4_;
      auVar116._16_4_ = auVar138._16_4_ + auVar140._16_4_;
      auVar116._20_4_ = auVar138._20_4_ + auVar140._20_4_;
      auVar116._24_4_ = auVar138._24_4_ + auVar140._24_4_;
      auVar116._28_4_ = auVar138._28_4_ + auVar140._28_4_;
      auVar34._4_4_ = auVar96._4_4_ * auVar106._4_4_;
      auVar34._0_4_ = auVar96._0_4_ * auVar106._0_4_;
      auVar34._8_4_ = auVar96._8_4_ * auVar106._8_4_;
      auVar34._12_4_ = auVar96._12_4_ * auVar106._12_4_;
      auVar34._16_4_ = auVar96._16_4_ * auVar106._16_4_;
      auVar34._20_4_ = auVar96._20_4_ * auVar106._20_4_;
      auVar34._24_4_ = auVar96._24_4_ * auVar106._24_4_;
      auVar34._28_4_ = fVar114;
      auVar22 = vfmsub231ps_fma(auVar34,auVar141,auVar116);
      auVar35._4_4_ = auVar160._4_4_ * auVar116._4_4_;
      auVar35._0_4_ = auVar160._0_4_ * auVar116._0_4_;
      auVar35._8_4_ = auVar160._8_4_ * auVar116._8_4_;
      auVar35._12_4_ = auVar160._12_4_ * auVar116._12_4_;
      auVar35._16_4_ = auVar160._16_4_ * auVar116._16_4_;
      auVar35._20_4_ = auVar160._20_4_ * auVar116._20_4_;
      auVar35._24_4_ = auVar160._24_4_ * auVar116._24_4_;
      auVar35._28_4_ = auVar116._28_4_;
      auVar21 = vfmsub231ps_fma(auVar35,auVar96,auVar94);
      auVar36._4_4_ = auVar94._4_4_ * auVar141._4_4_;
      auVar36._0_4_ = auVar94._0_4_ * auVar141._0_4_;
      auVar36._8_4_ = auVar94._8_4_ * auVar141._8_4_;
      auVar36._12_4_ = auVar94._12_4_ * auVar141._12_4_;
      auVar36._16_4_ = auVar94._16_4_ * auVar141._16_4_;
      auVar36._20_4_ = auVar94._20_4_ * auVar141._20_4_;
      auVar36._24_4_ = auVar94._24_4_ * auVar141._24_4_;
      auVar36._28_4_ = auVar94._28_4_;
      auVar23 = vfmsub231ps_fma(auVar36,auVar160,auVar106);
      _local_2c20 = *(undefined1 (*) [32])pRVar1;
      auVar95._0_4_ = fVar124 * auVar23._0_4_;
      auVar95._4_4_ = fVar125 * auVar23._4_4_;
      auVar95._8_4_ = fVar126 * auVar23._8_4_;
      auVar95._12_4_ = fVar127 * auVar23._12_4_;
      auVar95._16_4_ = fVar128 * 0.0;
      auVar95._20_4_ = fVar129 * 0.0;
      auVar95._24_4_ = fVar66 * 0.0;
      auVar95._28_4_ = 0;
      auVar21 = vfmadd231ps_fma(auVar95,local_2e80,ZEXT1632(auVar21));
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),local_2ce0,ZEXT1632(auVar22));
      auVar138 = ZEXT1632(CONCAT412(auVar21._12_4_ + auVar104._12_4_ + auVar19._12_4_,
                                    CONCAT48(auVar21._8_4_ + auVar104._8_4_ + auVar19._8_4_,
                                             CONCAT44(auVar21._4_4_ + auVar104._4_4_ + auVar19._4_4_
                                                      ,auVar21._0_4_ +
                                                       auVar104._0_4_ + auVar19._0_4_))));
      local_2700 = ZEXT1632(auVar104);
      auVar117 = vminps_avx(local_2700,ZEXT1632(auVar19));
      auVar117 = vminps_avx(auVar117,ZEXT1632(auVar21));
      local_2720 = vandps_avx(local_2b60,auVar138);
      local_2d40._8_4_ = 0x80000000;
      local_2d40._0_8_ = 0x8000000080000000;
      local_2d40._12_4_ = 0x80000000;
      local_2d40._16_4_ = 0x80000000;
      local_2d40._20_4_ = 0x80000000;
      local_2d40._24_4_ = 0x80000000;
      local_2d40._28_4_ = 0x80000000;
      auVar142 = ZEXT3264(local_2d40);
      fVar114 = local_2720._0_4_ * 1.1920929e-07;
      fVar124 = local_2720._4_4_ * 1.1920929e-07;
      auVar37._4_4_ = fVar124;
      auVar37._0_4_ = fVar114;
      fVar125 = local_2720._8_4_ * 1.1920929e-07;
      auVar37._8_4_ = fVar125;
      fVar126 = local_2720._12_4_ * 1.1920929e-07;
      auVar37._12_4_ = fVar126;
      fVar127 = local_2720._16_4_ * 1.1920929e-07;
      auVar37._16_4_ = fVar127;
      fVar128 = local_2720._20_4_ * 1.1920929e-07;
      auVar37._20_4_ = fVar128;
      fVar129 = local_2720._24_4_ * 1.1920929e-07;
      auVar37._24_4_ = fVar129;
      auVar37._28_4_ = 0x34000000;
      auVar131._0_8_ = CONCAT44(fVar124,fVar114) ^ 0x8000000080000000;
      auVar131._8_4_ = -fVar125;
      auVar131._12_4_ = -fVar126;
      auVar131._16_4_ = -fVar127;
      auVar131._20_4_ = -fVar128;
      auVar131._24_4_ = -fVar129;
      auVar131._28_4_ = 0xb4000000;
      auVar117 = vcmpps_avx(auVar117,auVar131,5);
      auVar136 = vmaxps_avx(local_2700,ZEXT1632(auVar19));
      auVar136 = vmaxps_avx(auVar136,ZEXT1632(auVar21));
      auVar136 = vcmpps_avx(auVar136,auVar37,2);
      auVar136 = vorps_avx(auVar117,auVar136);
      auVar140 = auVar105 & auVar136;
      local_2e60 = auVar105;
      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar140 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar140 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar140 >> 0x7f,0) == '\0') &&
            (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar140 >> 0xbf,0) == '\0') &&
          (auVar140 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar140[0x1f]) {
LAB_015c3e8d:
        auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
      }
      else {
        local_2740 = auVar138;
        local_2c60 = auVar136;
        auVar38._4_4_ = fVar102 * local_2bc0._4_4_;
        auVar38._0_4_ = fVar101 * local_2bc0._0_4_;
        auVar38._8_4_ = fVar103 * local_2bc0._8_4_;
        auVar38._12_4_ = fVar15 * local_2bc0._12_4_;
        auVar38._16_4_ = fVar16 * local_2bc0._16_4_;
        auVar38._20_4_ = fVar17 * local_2bc0._20_4_;
        auVar38._24_4_ = fVar18 * local_2bc0._24_4_;
        auVar38._28_4_ = auVar136._28_4_;
        auVar39._4_4_ = fVar165 * local_2be0._4_4_;
        auVar39._0_4_ = fVar162 * local_2be0._0_4_;
        auVar39._8_4_ = fVar166 * local_2be0._8_4_;
        auVar39._12_4_ = fVar167 * local_2be0._12_4_;
        auVar39._16_4_ = fVar168 * local_2be0._16_4_;
        auVar39._20_4_ = fVar169 * local_2be0._20_4_;
        auVar39._24_4_ = fVar170 * local_2be0._24_4_;
        auVar39._28_4_ = auVar117._28_4_;
        auVar21 = vfmsub213ps_fma(local_2be0,auVar157,auVar38);
        auVar40._4_4_ = fVar173 * auVar141._4_4_;
        auVar40._0_4_ = fVar171 * auVar141._0_4_;
        auVar40._8_4_ = fVar174 * auVar141._8_4_;
        auVar40._12_4_ = fVar175 * auVar141._12_4_;
        auVar40._16_4_ = fVar176 * auVar141._16_4_;
        auVar40._20_4_ = fVar177 * auVar141._20_4_;
        auVar40._24_4_ = fVar178 * auVar141._24_4_;
        auVar40._28_4_ = 0x34000000;
        auVar41._4_4_ = fVar165 * auVar96._4_4_;
        auVar41._0_4_ = fVar162 * auVar96._0_4_;
        auVar41._8_4_ = fVar166 * auVar96._8_4_;
        auVar41._12_4_ = fVar167 * auVar96._12_4_;
        auVar41._16_4_ = fVar168 * auVar96._16_4_;
        auVar41._20_4_ = fVar169 * auVar96._20_4_;
        auVar41._24_4_ = fVar170 * auVar96._24_4_;
        auVar41._28_4_ = auVar105._28_4_;
        auVar22 = vfmsub213ps_fma(auVar96,local_2c40,auVar40);
        auVar117 = vandps_avx(local_2b60,auVar38);
        auVar96 = vandps_avx(local_2b60,auVar40);
        auVar117 = vcmpps_avx(auVar117,auVar96,1);
        local_2ae0.field_0.x.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar22),ZEXT1632(auVar21),auVar117);
        auVar155 = ZEXT3264((undefined1  [32])local_2ae0.field_0.x.field_0);
        auVar42._4_4_ = auVar160._4_4_ * fVar102;
        auVar42._0_4_ = auVar160._0_4_ * fVar101;
        auVar42._8_4_ = auVar160._8_4_ * fVar103;
        auVar42._12_4_ = auVar160._12_4_ * fVar15;
        auVar42._16_4_ = auVar160._16_4_ * fVar16;
        auVar42._20_4_ = auVar160._20_4_ * fVar17;
        auVar42._24_4_ = auVar160._24_4_ * fVar18;
        auVar42._28_4_ = auVar117._28_4_;
        auVar21 = vfmsub213ps_fma(auVar160,auVar157,auVar41);
        auVar43._4_4_ = local_2c00._4_4_ * fVar173;
        auVar43._0_4_ = local_2c00._0_4_ * fVar171;
        auVar43._8_4_ = local_2c00._8_4_ * fVar174;
        auVar43._12_4_ = local_2c00._12_4_ * fVar175;
        auVar43._16_4_ = local_2c00._16_4_ * fVar176;
        auVar43._20_4_ = local_2c00._20_4_ * fVar177;
        auVar43._24_4_ = local_2c00._24_4_ * fVar178;
        auVar43._28_4_ = auVar96._28_4_;
        auVar22 = vfmsub213ps_fma(local_2bc0,auVar118,auVar43);
        auVar117 = vandps_avx(local_2b60,auVar43);
        auVar96 = vandps_avx(local_2b60,auVar41);
        auVar117 = vcmpps_avx(auVar117,auVar96,1);
        local_2ae0.field_0.y.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar21),ZEXT1632(auVar22),auVar117);
        auVar21 = vfmsub213ps_fma(local_2c00,local_2c40,auVar39);
        auVar22 = vfmsub213ps_fma(auVar141,auVar118,auVar42);
        auVar117 = vandps_avx(local_2b60,auVar39);
        auVar118 = vandps_avx(local_2b60,auVar42);
        auVar117 = vcmpps_avx(auVar117,auVar118,1);
        local_2ae0.field_0.z.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar22),ZEXT1632(auVar21),auVar117);
        auVar148 = ZEXT3264((undefined1  [32])local_2ae0.field_0.z.field_0);
        local_2c20._0_4_ = auVar75._0_4_;
        local_2c20._4_4_ = auVar75._4_4_;
        fStack_2c18 = auVar75._8_4_;
        fStack_2c14 = auVar75._12_4_;
        fStack_2c10 = auVar75._16_4_;
        fStack_2c0c = auVar75._20_4_;
        fStack_2c08 = auVar75._24_4_;
        auVar44._4_4_ = local_2ae0._68_4_ * (float)local_2c20._4_4_;
        auVar44._0_4_ = local_2ae0._64_4_ * (float)local_2c20._0_4_;
        auVar44._8_4_ = local_2ae0._72_4_ * fStack_2c18;
        auVar44._12_4_ = local_2ae0._76_4_ * fStack_2c14;
        auVar44._16_4_ = local_2ae0._80_4_ * fStack_2c10;
        auVar44._20_4_ = local_2ae0._84_4_ * fStack_2c0c;
        auVar44._24_4_ = local_2ae0._88_4_ * fStack_2c08;
        auVar44._28_4_ = auVar117._28_4_;
        auVar21 = vfmadd213ps_fma(local_2e80,(undefined1  [32])local_2ae0.field_0.y.field_0,auVar44)
        ;
        auVar21 = vfmadd213ps_fma(local_2ce0,(undefined1  [32])local_2ae0.field_0.x.field_0,
                                  ZEXT1632(auVar21));
        fVar114 = auVar21._0_4_ + auVar21._0_4_;
        fVar101 = auVar21._4_4_ + auVar21._4_4_;
        fVar102 = auVar21._8_4_ + auVar21._8_4_;
        fVar103 = auVar21._12_4_ + auVar21._12_4_;
        auVar96 = ZEXT1632(CONCAT412(fVar103,CONCAT48(fVar102,CONCAT44(fVar101,fVar114))));
        auVar107._0_4_ = local_2ae0._64_4_ * fVar8;
        auVar107._4_4_ = local_2ae0._68_4_ * fVar9;
        auVar107._8_4_ = local_2ae0._72_4_ * fVar10;
        auVar107._12_4_ = local_2ae0._76_4_ * fVar11;
        auVar107._16_4_ = local_2ae0._80_4_ * fVar12;
        auVar107._20_4_ = local_2ae0._84_4_ * fVar13;
        auVar107._24_4_ = local_2ae0._88_4_ * fVar14;
        auVar107._28_4_ = 0;
        auVar21 = vfmadd213ps_fma(local_2b80,(undefined1  [32])local_2ae0.field_0.y.field_0,auVar107
                                 );
        auVar22 = vfmadd213ps_fma(local_2d00,(undefined1  [32])local_2ae0.field_0.x.field_0,
                                  ZEXT1632(auVar21));
        auVar117 = vrcpps_avx(auVar96);
        auVar150._8_4_ = 0x3f800000;
        auVar150._0_8_ = 0x3f8000003f800000;
        auVar150._12_4_ = 0x3f800000;
        auVar150._16_4_ = 0x3f800000;
        auVar150._20_4_ = 0x3f800000;
        auVar150._24_4_ = 0x3f800000;
        auVar150._28_4_ = 0x3f800000;
        auVar21 = vfnmadd213ps_fma(auVar117,auVar96,auVar150);
        auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar117,auVar117);
        local_2a80 = ZEXT1632(CONCAT412((auVar22._12_4_ + auVar22._12_4_) * auVar21._12_4_,
                                        CONCAT48((auVar22._8_4_ + auVar22._8_4_) * auVar21._8_4_,
                                                 CONCAT44((auVar22._4_4_ + auVar22._4_4_) *
                                                          auVar21._4_4_,
                                                          (auVar22._0_4_ + auVar22._0_4_) *
                                                          auVar21._0_4_))));
        auVar117 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_2a80,2);
        auVar118 = vcmpps_avx(local_2a80,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar117 = vandps_avx(auVar117,auVar118);
        auVar132._0_8_ = CONCAT44(fVar101,fVar114) ^ 0x8000000080000000;
        auVar132._8_4_ = -fVar102;
        auVar132._12_4_ = -fVar103;
        auVar132._16_4_ = 0x80000000;
        auVar132._20_4_ = 0x80000000;
        auVar132._24_4_ = 0x80000000;
        auVar132._28_4_ = 0x80000000;
        auVar118 = vcmpps_avx(auVar96,auVar132,4);
        auVar117 = vandps_avx(auVar118,auVar117);
        auVar136 = vandps_avx(auVar105,auVar136);
        auVar117 = vpslld_avx2(auVar117,0x1f);
        auVar118 = vpsrad_avx2(auVar117,0x1f);
        auVar117 = auVar136 & auVar118;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) goto LAB_015c3e8d;
        auVar117 = vandps_avx(auVar118,auVar136);
        pGVar5 = (context->scene->geometries).items[uVar82].ptr;
        uVar2 = pGVar5->mask;
        auVar119._4_4_ = uVar2;
        auVar119._0_4_ = uVar2;
        auVar119._8_4_ = uVar2;
        auVar119._12_4_ = uVar2;
        auVar119._16_4_ = uVar2;
        auVar119._20_4_ = uVar2;
        auVar119._24_4_ = uVar2;
        auVar119._28_4_ = uVar2;
        auVar136 = vpand_avx2(auVar119,*(undefined1 (*) [32])(ray + 0x120));
        auVar118 = vpcmpeqd_avx2(auVar136,_DAT_01f7b000);
        auVar136 = auVar117 & ~auVar118;
        auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
        if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar136 >> 0x7f,0) == '\0') &&
              (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar136 >> 0xbf,0) == '\0') &&
            (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar136[0x1f]) {
          unaff_R12 = local_2e00._0_8_;
        }
        else {
          auVar117 = vandnps_avx(auVar118,auVar117);
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            local_2e80._0_8_ = lVar79;
            auVar105 = vrcpps_avx(auVar138);
            auVar153._8_4_ = 0x3f800000;
            auVar153._0_8_ = 0x3f8000003f800000;
            auVar153._12_4_ = 0x3f800000;
            auVar153._16_4_ = 0x3f800000;
            auVar153._20_4_ = 0x3f800000;
            auVar153._24_4_ = 0x3f800000;
            auVar153._28_4_ = 0x3f800000;
            auVar21 = vfnmadd213ps_fma(auVar138,auVar105,auVar153);
            auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar105,auVar105);
            auVar98._8_4_ = 0x219392ef;
            auVar98._0_8_ = 0x219392ef219392ef;
            auVar98._12_4_ = 0x219392ef;
            auVar98._16_4_ = 0x219392ef;
            auVar98._20_4_ = 0x219392ef;
            auVar98._24_4_ = 0x219392ef;
            auVar98._28_4_ = 0x219392ef;
            auVar105 = vcmpps_avx(local_2720,auVar98,5);
            auVar105 = vandps_avx(auVar105,ZEXT1632(auVar21));
            auVar62._4_4_ = auVar105._4_4_ * auVar104._4_4_;
            auVar62._0_4_ = auVar105._0_4_ * auVar104._0_4_;
            auVar62._8_4_ = auVar105._8_4_ * auVar104._8_4_;
            auVar62._12_4_ = auVar105._12_4_ * auVar104._12_4_;
            auVar62._16_4_ = auVar105._16_4_ * 0.0;
            auVar62._20_4_ = auVar105._20_4_ * 0.0;
            auVar62._24_4_ = auVar105._24_4_ * 0.0;
            auVar62._28_4_ = local_2720._28_4_;
            auVar136 = vminps_avx(auVar62,auVar153);
            auVar63._4_4_ = auVar19._4_4_ * auVar105._4_4_;
            auVar63._0_4_ = auVar19._0_4_ * auVar105._0_4_;
            auVar63._8_4_ = auVar19._8_4_ * auVar105._8_4_;
            auVar63._12_4_ = auVar19._12_4_ * auVar105._12_4_;
            auVar63._16_4_ = auVar105._16_4_ * 0.0;
            auVar63._20_4_ = auVar105._20_4_ * 0.0;
            auVar63._24_4_ = auVar105._24_4_ * 0.0;
            auVar63._28_4_ = auVar105._28_4_;
            auVar105 = vminps_avx(auVar63,auVar153);
            auVar118 = vsubps_avx(auVar153,auVar136);
            auVar96 = vsubps_avx(auVar153,auVar105);
            auVar71._8_8_ = uStack_2758;
            auVar71._0_8_ = local_2760;
            auVar71._16_8_ = uStack_2750;
            auVar71._24_8_ = uStack_2748;
            local_2a40 = vblendvps_avx(auVar136,auVar118,auVar71);
            local_2a60 = vblendvps_avx(auVar105,auVar96,auVar71);
            local_2eb0.valid = local_29c0;
            local_2eb0.geometryUserPtr = &local_2b40;
            local_2eb0.context = local_2b20;
            local_2eb0.ray = local_2b00;
            local_2d00._0_4_ = *(undefined4 *)((long)&local_2cb0 + lVar85 * 4);
            auVar142 = ZEXT1664(auVar96._0_16_);
            auVar148 = ZEXT1664(local_2ae0._64_16_);
            auVar155 = ZEXT1664(local_2ae0._0_16_);
            local_2ce0 = auVar117;
            std::
            _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
            ::
            _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                      ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                        *)&local_2eb0,
                       (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                        *)&local_2ae0.field_0);
            pRVar6 = context->user;
            local_2a40._4_4_ = local_2d00._0_4_;
            local_2a40._0_4_ = local_2d00._0_4_;
            local_2a40._8_4_ = local_2d00._0_4_;
            local_2a40._12_4_ = local_2d00._0_4_;
            local_2a40._16_4_ = local_2d00._0_4_;
            local_2a40._20_4_ = local_2d00._0_4_;
            local_2a40._24_4_ = local_2d00._0_4_;
            local_2a40._28_4_ = local_2d00._0_4_;
            local_2a20 = local_2dc0._0_4_;
            uStack_2a1c = local_2dc0._0_4_;
            uStack_2a18 = local_2dc0._0_4_;
            uStack_2a14 = local_2dc0._0_4_;
            uStack_2a10 = local_2dc0._0_4_;
            uStack_2a0c = local_2dc0._0_4_;
            uStack_2a08 = local_2dc0._0_4_;
            uStack_2a04 = local_2dc0._0_4_;
            auVar136 = vpcmpeqd_avx2(local_2a40,local_2a40);
            local_2dc8[1] = auVar136;
            *local_2dc8 = auVar136;
            local_2a00 = pRVar6->instID[0];
            uStack_29fc = local_2a00;
            uStack_29f8 = local_2a00;
            uStack_29f4 = local_2a00;
            uStack_29f0 = local_2a00;
            uStack_29ec = local_2a00;
            uStack_29e8 = local_2a00;
            uStack_29e4 = local_2a00;
            local_29e0 = pRVar6->instPrimID[0];
            uStack_29dc = local_29e0;
            uStack_29d8 = local_29e0;
            uStack_29d4 = local_29e0;
            uStack_29d0 = local_29e0;
            uStack_29cc = local_29e0;
            uStack_29c8 = local_29e0;
            uStack_29c4 = local_29e0;
            auVar105 = *(undefined1 (*) [32])(ray + 0x100);
            auVar117 = vblendvps_avx(auVar105,(undefined1  [32])local_2b40,local_2ce0);
            *(undefined1 (*) [32])(ray + 0x100) = auVar117;
            local_2d80 = local_2ce0;
            local_2eb0.valid = (int *)local_2d80;
            local_2eb0.geometryUserPtr = pGVar5->userPtr;
            local_2eb0.context = context->user;
            local_2eb0.hit = (RTCHitN *)&local_2ae0;
            local_2eb0.N = 8;
            local_2eb0.ray = (RTCRayN *)ray;
            if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
              auVar142 = ZEXT1664(auVar142._0_16_);
              auVar148 = ZEXT1664(auVar148._0_16_);
              auVar155 = ZEXT1664(auVar155._0_16_);
              _local_2dc0 = auVar105;
              (*pGVar5->occlusionFilterN)(&local_2eb0);
              auVar159._8_56_ = extraout_var;
              auVar159._0_8_ = extraout_XMM1_Qa;
              auVar136 = vpcmpeqd_avx2(auVar159._0_32_,auVar159._0_32_);
              auVar105 = _local_2dc0;
            }
            auVar117 = vpcmpeqd_avx2(local_2d80,_DAT_01f7b000);
            auVar118 = auVar136 & ~auVar117;
            if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar118 >> 0x7f,0) == '\0') &&
                  (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0xbf,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar118[0x1f]) {
              auVar117 = auVar117 ^ auVar136;
              auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              lVar79 = local_2e80._0_8_;
            }
            else {
              p_Var7 = context->args->filter;
              if (p_Var7 == (RTCFilterFunctionN)0x0) {
                auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              }
              else {
                auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT) || (((pGVar5->field_8).field_0x2 & 0x40) != 0))
                {
                  auVar142 = ZEXT1664(auVar142._0_16_);
                  auVar148 = ZEXT1664(auVar148._0_16_);
                  auVar155 = ZEXT1664(auVar155._0_16_);
                  _local_2dc0 = auVar105;
                  (*p_Var7)(&local_2eb0);
                  auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                                CONCAT424(0x3f800003,
                                                          CONCAT420(0x3f800003,
                                                                    CONCAT416(0x3f800003,
                                                                              CONCAT412(0x3f800003,
                                                                                        CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                  auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                                CONCAT424(0x3f7ffffa,
                                                          CONCAT420(0x3f7ffffa,
                                                                    CONCAT416(0x3f7ffffa,
                                                                              CONCAT412(0x3f7ffffa,
                                                                                        CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                  auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                                CONCAT424(0x7f800000,
                                                          CONCAT420(0x7f800000,
                                                                    CONCAT416(0x7f800000,
                                                                              CONCAT412(0x7f800000,
                                                                                        CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                  auVar105 = _local_2dc0;
                }
              }
              auVar136 = vpcmpeqd_avx2(local_2d80,_DAT_01f7b000);
              auVar117 = auVar136 ^ _DAT_01f7b020;
              auVar111._8_4_ = 0xff800000;
              auVar111._0_8_ = 0xff800000ff800000;
              auVar111._12_4_ = 0xff800000;
              auVar111._16_4_ = 0xff800000;
              auVar111._20_4_ = 0xff800000;
              auVar111._24_4_ = 0xff800000;
              auVar111._28_4_ = 0xff800000;
              auVar136 = vblendvps_avx(auVar111,*(undefined1 (*) [32])(local_2eb0.ray + 0x100),
                                       auVar136);
              *(undefined1 (*) [32])(local_2eb0.ray + 0x100) = auVar136;
              lVar79 = local_2e80._0_8_;
            }
            auVar105 = vblendvps_avx(auVar105,*(undefined1 (*) [32])local_2e28,auVar117);
            *(undefined1 (*) [32])local_2e28 = auVar105;
          }
          auVar105 = vandnps_avx(auVar117,local_2e60);
          unaff_R12 = local_2e00._0_8_;
        }
      }
      if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar105 >> 0x7f,0) == '\0') &&
            (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0xbf,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar105[0x1f]) break;
      auVar117 = *(undefined1 (*) [32])ray;
      auVar136 = *(undefined1 (*) [32])(ray + 0x20);
      auVar118 = *(undefined1 (*) [32])(ray + 0x40);
      auVar74._4_4_ = uStack_263c;
      auVar74._0_4_ = local_2640;
      auVar74._8_4_ = uStack_2638;
      auVar74._12_4_ = uStack_2634;
      auVar74._16_4_ = uStack_2630;
      auVar74._20_4_ = uStack_262c;
      auVar74._24_4_ = uStack_2628;
      auVar74._28_4_ = uStack_2624;
      auVar96 = vsubps_avx(auVar74,auVar117);
      auVar73._4_4_ = uStack_265c;
      auVar73._0_4_ = local_2660;
      auVar73._8_4_ = uStack_2658;
      auVar73._12_4_ = uStack_2654;
      auVar73._16_4_ = uStack_2650;
      auVar73._20_4_ = uStack_264c;
      auVar73._24_4_ = uStack_2648;
      auVar73._28_4_ = uStack_2644;
      local_2ce0 = vsubps_avx(auVar73,auVar136);
      auVar72._4_4_ = uStack_267c;
      auVar72._0_4_ = local_2680;
      auVar72._8_4_ = uStack_2678;
      auVar72._12_4_ = uStack_2674;
      auVar72._16_4_ = uStack_2670;
      auVar72._20_4_ = uStack_266c;
      auVar72._24_4_ = uStack_2668;
      auVar72._28_4_ = uStack_2664;
      local_2d00 = vsubps_avx(auVar72,auVar118);
      auVar140 = vsubps_avx(local_26a0,auVar117);
      auVar141 = vsubps_avx(local_26c0,auVar136);
      auVar138 = vsubps_avx(local_26e0,auVar118);
      auVar157 = vsubps_avx(_local_2e20,auVar117);
      auVar136 = vsubps_avx(local_2c80,auVar136);
      auVar118 = vsubps_avx(_local_2da0,auVar118);
      local_2b80 = vsubps_avx(auVar157,auVar96);
      local_2bc0 = vsubps_avx(auVar136,local_2ce0);
      local_2ba0 = vsubps_avx(auVar118,local_2d00);
      auVar151._0_4_ = auVar157._0_4_ + auVar96._0_4_;
      auVar151._4_4_ = auVar157._4_4_ + auVar96._4_4_;
      auVar151._8_4_ = auVar157._8_4_ + auVar96._8_4_;
      auVar151._12_4_ = auVar157._12_4_ + auVar96._12_4_;
      auVar151._16_4_ = auVar157._16_4_ + auVar96._16_4_;
      auVar151._20_4_ = auVar157._20_4_ + auVar96._20_4_;
      auVar151._24_4_ = auVar157._24_4_ + auVar96._24_4_;
      auVar151._28_4_ = auVar157._28_4_ + auVar96._28_4_;
      auVar158._0_4_ = auVar136._0_4_ + local_2ce0._0_4_;
      auVar158._4_4_ = auVar136._4_4_ + local_2ce0._4_4_;
      auVar158._8_4_ = auVar136._8_4_ + local_2ce0._8_4_;
      auVar158._12_4_ = auVar136._12_4_ + local_2ce0._12_4_;
      auVar158._16_4_ = auVar136._16_4_ + local_2ce0._16_4_;
      auVar158._20_4_ = auVar136._20_4_ + local_2ce0._20_4_;
      auVar158._24_4_ = auVar136._24_4_ + local_2ce0._24_4_;
      fVar114 = local_2ce0._28_4_;
      auVar158._28_4_ = auVar136._28_4_ + fVar114;
      fVar8 = local_2d00._0_4_;
      auVar164._0_4_ = auVar118._0_4_ + fVar8;
      fVar9 = local_2d00._4_4_;
      auVar164._4_4_ = auVar118._4_4_ + fVar9;
      fVar10 = local_2d00._8_4_;
      auVar164._8_4_ = auVar118._8_4_ + fVar10;
      fVar11 = local_2d00._12_4_;
      auVar164._12_4_ = auVar118._12_4_ + fVar11;
      fVar12 = local_2d00._16_4_;
      auVar164._16_4_ = auVar118._16_4_ + fVar12;
      fVar13 = local_2d00._20_4_;
      auVar164._20_4_ = auVar118._20_4_ + fVar13;
      fVar14 = local_2d00._24_4_;
      auVar164._24_4_ = auVar118._24_4_ + fVar14;
      auVar164._28_4_ = auVar118._28_4_ + local_2d00._28_4_;
      auVar142._0_4_ = auVar158._0_4_ * local_2ba0._0_4_;
      auVar142._4_4_ = auVar158._4_4_ * local_2ba0._4_4_;
      auVar142._8_4_ = auVar158._8_4_ * local_2ba0._8_4_;
      auVar142._12_4_ = auVar158._12_4_ * local_2ba0._12_4_;
      auVar142._16_4_ = auVar158._16_4_ * local_2ba0._16_4_;
      auVar142._20_4_ = auVar158._20_4_ * local_2ba0._20_4_;
      auVar142._28_36_ = auVar172._28_36_;
      auVar142._24_4_ = auVar158._24_4_ * local_2ba0._24_4_;
      auVar19 = vfmsub231ps_fma(auVar142._0_32_,local_2bc0,auVar164);
      auVar45._4_4_ = auVar164._4_4_ * local_2b80._4_4_;
      auVar45._0_4_ = auVar164._0_4_ * local_2b80._0_4_;
      auVar45._8_4_ = auVar164._8_4_ * local_2b80._8_4_;
      auVar45._12_4_ = auVar164._12_4_ * local_2b80._12_4_;
      auVar45._16_4_ = auVar164._16_4_ * local_2b80._16_4_;
      auVar45._20_4_ = auVar164._20_4_ * local_2b80._20_4_;
      auVar45._24_4_ = auVar164._24_4_ * local_2b80._24_4_;
      auVar45._28_4_ = auVar164._28_4_;
      auVar104 = vfmsub231ps_fma(auVar45,local_2ba0,auVar151);
      auVar46._4_4_ = auVar151._4_4_ * local_2bc0._4_4_;
      auVar46._0_4_ = auVar151._0_4_ * local_2bc0._0_4_;
      auVar46._8_4_ = auVar151._8_4_ * local_2bc0._8_4_;
      auVar46._12_4_ = auVar151._12_4_ * local_2bc0._12_4_;
      auVar46._16_4_ = auVar151._16_4_ * local_2bc0._16_4_;
      auVar46._20_4_ = auVar151._20_4_ * local_2bc0._20_4_;
      auVar46._24_4_ = auVar151._24_4_ * local_2bc0._24_4_;
      auVar46._28_4_ = auVar151._28_4_;
      auVar21 = vfmsub231ps_fma(auVar46,local_2b80,auVar158);
      pRVar1 = ray + 0xc0;
      fVar124 = *(float *)pRVar1;
      fVar125 = *(float *)(ray + 0xc4);
      fVar126 = *(float *)(ray + 200);
      fVar127 = *(float *)(ray + 0xcc);
      fVar128 = *(float *)(ray + 0xd0);
      fVar129 = *(float *)(ray + 0xd4);
      fVar66 = *(float *)(ray + 0xd8);
      auVar75 = *(undefined1 (*) [28])pRVar1;
      auVar29 = *(undefined1 (*) [32])pRVar1;
      auVar148._0_4_ = auVar21._0_4_ * fVar124;
      auVar148._4_4_ = auVar21._4_4_ * fVar125;
      auVar148._8_4_ = auVar21._8_4_ * fVar126;
      auVar148._12_4_ = auVar21._12_4_ * fVar127;
      auVar148._16_4_ = fVar128 * 0.0;
      auVar148._20_4_ = fVar129 * 0.0;
      auVar148._28_36_ = auVar155._28_36_;
      auVar148._24_4_ = fVar66 * 0.0;
      _local_2e20 = *(undefined1 (*) [32])(ray + 0xa0);
      auVar142 = ZEXT3264(_local_2e20);
      auVar104 = vfmadd231ps_fma(auVar148._0_32_,_local_2e20,ZEXT1632(auVar104));
      auVar117 = *(undefined1 (*) [32])(ray + 0x80);
      auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar117,ZEXT1632(auVar19));
      auVar155 = ZEXT1664(auVar104);
      local_2be0 = vsubps_avx(local_2ce0,auVar141);
      local_2c00 = vsubps_avx(local_2d00,auVar138);
      auVar152._0_4_ = local_2ce0._0_4_ + auVar141._0_4_;
      auVar152._4_4_ = local_2ce0._4_4_ + auVar141._4_4_;
      auVar152._8_4_ = local_2ce0._8_4_ + auVar141._8_4_;
      auVar152._12_4_ = local_2ce0._12_4_ + auVar141._12_4_;
      auVar152._16_4_ = local_2ce0._16_4_ + auVar141._16_4_;
      auVar152._20_4_ = local_2ce0._20_4_ + auVar141._20_4_;
      auVar152._24_4_ = local_2ce0._24_4_ + auVar141._24_4_;
      auVar152._28_4_ = fVar114 + auVar141._28_4_;
      auVar120._0_4_ = auVar138._0_4_ + fVar8;
      auVar120._4_4_ = auVar138._4_4_ + fVar9;
      auVar120._8_4_ = auVar138._8_4_ + fVar10;
      auVar120._12_4_ = auVar138._12_4_ + fVar11;
      auVar120._16_4_ = auVar138._16_4_ + fVar12;
      auVar120._20_4_ = auVar138._20_4_ + fVar13;
      auVar120._24_4_ = auVar138._24_4_ + fVar14;
      auVar120._28_4_ = auVar138._28_4_ + local_2d00._28_4_;
      fVar101 = local_2c00._0_4_;
      fVar102 = local_2c00._4_4_;
      auVar47._4_4_ = auVar152._4_4_ * fVar102;
      auVar47._0_4_ = auVar152._0_4_ * fVar101;
      fVar103 = local_2c00._8_4_;
      auVar47._8_4_ = auVar152._8_4_ * fVar103;
      fVar15 = local_2c00._12_4_;
      auVar47._12_4_ = auVar152._12_4_ * fVar15;
      fVar16 = local_2c00._16_4_;
      auVar47._16_4_ = auVar152._16_4_ * fVar16;
      fVar17 = local_2c00._20_4_;
      auVar47._20_4_ = auVar152._20_4_ * fVar17;
      fVar18 = local_2c00._24_4_;
      auVar47._24_4_ = auVar152._24_4_ * fVar18;
      auVar47._28_4_ = fVar114;
      auVar21 = vfmsub231ps_fma(auVar47,local_2be0,auVar120);
      auVar160 = vsubps_avx(auVar96,auVar140);
      fVar171 = auVar160._0_4_;
      fVar173 = auVar160._4_4_;
      auVar48._4_4_ = fVar173 * auVar120._4_4_;
      auVar48._0_4_ = fVar171 * auVar120._0_4_;
      fVar174 = auVar160._8_4_;
      auVar48._8_4_ = fVar174 * auVar120._8_4_;
      fVar175 = auVar160._12_4_;
      auVar48._12_4_ = fVar175 * auVar120._12_4_;
      fVar176 = auVar160._16_4_;
      auVar48._16_4_ = fVar176 * auVar120._16_4_;
      fVar177 = auVar160._20_4_;
      auVar48._20_4_ = fVar177 * auVar120._20_4_;
      fVar178 = auVar160._24_4_;
      auVar48._24_4_ = fVar178 * auVar120._24_4_;
      auVar48._28_4_ = auVar120._28_4_;
      auVar146._0_4_ = auVar140._0_4_ + auVar96._0_4_;
      auVar146._4_4_ = auVar140._4_4_ + auVar96._4_4_;
      auVar146._8_4_ = auVar140._8_4_ + auVar96._8_4_;
      auVar146._12_4_ = auVar140._12_4_ + auVar96._12_4_;
      auVar146._16_4_ = auVar140._16_4_ + auVar96._16_4_;
      auVar146._20_4_ = auVar140._20_4_ + auVar96._20_4_;
      auVar146._24_4_ = auVar140._24_4_ + auVar96._24_4_;
      auVar146._28_4_ = auVar140._28_4_ + auVar96._28_4_;
      auVar19 = vfmsub231ps_fma(auVar48,local_2c00,auVar146);
      fVar162 = local_2be0._0_4_;
      fVar165 = local_2be0._4_4_;
      auVar49._4_4_ = fVar165 * auVar146._4_4_;
      auVar49._0_4_ = fVar162 * auVar146._0_4_;
      fVar166 = local_2be0._8_4_;
      auVar49._8_4_ = fVar166 * auVar146._8_4_;
      fVar167 = local_2be0._12_4_;
      auVar49._12_4_ = fVar167 * auVar146._12_4_;
      fVar168 = local_2be0._16_4_;
      auVar49._16_4_ = fVar168 * auVar146._16_4_;
      fVar169 = local_2be0._20_4_;
      auVar49._20_4_ = fVar169 * auVar146._20_4_;
      fVar170 = local_2be0._24_4_;
      auVar49._24_4_ = fVar170 * auVar146._24_4_;
      auVar49._28_4_ = auVar146._28_4_;
      auVar22 = vfmsub231ps_fma(auVar49,auVar160,auVar152);
      auVar147._0_4_ = fVar124 * auVar22._0_4_;
      auVar147._4_4_ = fVar125 * auVar22._4_4_;
      auVar147._8_4_ = fVar126 * auVar22._8_4_;
      auVar147._12_4_ = fVar127 * auVar22._12_4_;
      auVar147._16_4_ = fVar128 * 0.0;
      auVar147._20_4_ = fVar129 * 0.0;
      auVar147._24_4_ = fVar66 * 0.0;
      auVar147._28_4_ = 0;
      auVar19 = vfmadd231ps_fma(auVar147,_local_2e20,ZEXT1632(auVar19));
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar117,ZEXT1632(auVar21));
      auVar148 = ZEXT1664(auVar19);
      auVar20 = vsubps_avx(auVar140,auVar157);
      auVar121._0_4_ = auVar140._0_4_ + auVar157._0_4_;
      auVar121._4_4_ = auVar140._4_4_ + auVar157._4_4_;
      auVar121._8_4_ = auVar140._8_4_ + auVar157._8_4_;
      auVar121._12_4_ = auVar140._12_4_ + auVar157._12_4_;
      auVar121._16_4_ = auVar140._16_4_ + auVar157._16_4_;
      auVar121._20_4_ = auVar140._20_4_ + auVar157._20_4_;
      auVar121._24_4_ = auVar140._24_4_ + auVar157._24_4_;
      auVar121._28_4_ = auVar140._28_4_ + auVar157._28_4_;
      auVar157 = vsubps_avx(auVar141,auVar136);
      auVar108._0_4_ = auVar141._0_4_ + auVar136._0_4_;
      auVar108._4_4_ = auVar141._4_4_ + auVar136._4_4_;
      auVar108._8_4_ = auVar141._8_4_ + auVar136._8_4_;
      auVar108._12_4_ = auVar141._12_4_ + auVar136._12_4_;
      auVar108._16_4_ = auVar141._16_4_ + auVar136._16_4_;
      auVar108._20_4_ = auVar141._20_4_ + auVar136._20_4_;
      auVar108._24_4_ = auVar141._24_4_ + auVar136._24_4_;
      auVar108._28_4_ = auVar141._28_4_ + auVar136._28_4_;
      auVar141 = vsubps_avx(auVar138,auVar118);
      auVar97._0_4_ = auVar138._0_4_ + auVar118._0_4_;
      auVar97._4_4_ = auVar138._4_4_ + auVar118._4_4_;
      auVar97._8_4_ = auVar138._8_4_ + auVar118._8_4_;
      auVar97._12_4_ = auVar138._12_4_ + auVar118._12_4_;
      auVar97._16_4_ = auVar138._16_4_ + auVar118._16_4_;
      auVar97._20_4_ = auVar138._20_4_ + auVar118._20_4_;
      auVar97._24_4_ = auVar138._24_4_ + auVar118._24_4_;
      auVar97._28_4_ = auVar138._28_4_ + auVar118._28_4_;
      auVar133._0_4_ = auVar141._0_4_ * auVar108._0_4_;
      auVar133._4_4_ = auVar141._4_4_ * auVar108._4_4_;
      auVar133._8_4_ = auVar141._8_4_ * auVar108._8_4_;
      auVar133._12_4_ = auVar141._12_4_ * auVar108._12_4_;
      auVar133._16_4_ = auVar141._16_4_ * auVar108._16_4_;
      auVar133._20_4_ = auVar141._20_4_ * auVar108._20_4_;
      auVar133._24_4_ = auVar141._24_4_ * auVar108._24_4_;
      auVar133._28_4_ = 0;
      auVar22 = vfmsub231ps_fma(auVar133,auVar157,auVar97);
      auVar50._4_4_ = auVar20._4_4_ * auVar97._4_4_;
      auVar50._0_4_ = auVar20._0_4_ * auVar97._0_4_;
      auVar50._8_4_ = auVar20._8_4_ * auVar97._8_4_;
      auVar50._12_4_ = auVar20._12_4_ * auVar97._12_4_;
      auVar50._16_4_ = auVar20._16_4_ * auVar97._16_4_;
      auVar50._20_4_ = auVar20._20_4_ * auVar97._20_4_;
      auVar50._24_4_ = auVar20._24_4_ * auVar97._24_4_;
      auVar50._28_4_ = auVar97._28_4_;
      auVar21 = vfmsub231ps_fma(auVar50,auVar141,auVar121);
      auVar51._4_4_ = auVar121._4_4_ * auVar157._4_4_;
      auVar51._0_4_ = auVar121._0_4_ * auVar157._0_4_;
      auVar51._8_4_ = auVar121._8_4_ * auVar157._8_4_;
      auVar51._12_4_ = auVar121._12_4_ * auVar157._12_4_;
      auVar51._16_4_ = auVar121._16_4_ * auVar157._16_4_;
      auVar51._20_4_ = auVar121._20_4_ * auVar157._20_4_;
      auVar51._24_4_ = auVar121._24_4_ * auVar157._24_4_;
      auVar51._28_4_ = auVar121._28_4_;
      auVar23 = vfmsub231ps_fma(auVar51,auVar20,auVar108);
      auVar52._4_4_ = fVar125 * auVar23._4_4_;
      auVar52._0_4_ = fVar124 * auVar23._0_4_;
      auVar52._8_4_ = fVar126 * auVar23._8_4_;
      auVar52._12_4_ = fVar127 * auVar23._12_4_;
      auVar52._16_4_ = fVar128 * 0.0;
      auVar52._20_4_ = fVar129 * 0.0;
      auVar52._24_4_ = fVar66 * 0.0;
      auVar52._28_4_ = auVar108._28_4_;
      auVar21 = vfmadd231ps_fma(auVar52,_local_2e20,ZEXT1632(auVar21));
      auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar117,ZEXT1632(auVar22));
      local_2c60 = ZEXT1632(CONCAT412(auVar21._12_4_ + auVar104._12_4_ + auVar19._12_4_,
                                      CONCAT48(auVar21._8_4_ + auVar104._8_4_ + auVar19._8_4_,
                                               CONCAT44(auVar21._4_4_ +
                                                        auVar104._4_4_ + auVar19._4_4_,
                                                        auVar21._0_4_ +
                                                        auVar104._0_4_ + auVar19._0_4_))));
      _local_2c20 = ZEXT1632(auVar104);
      auVar136 = vminps_avx(_local_2c20,ZEXT1632(auVar19));
      auVar136 = vminps_avx(auVar136,ZEXT1632(auVar21));
      local_2c80 = vandps_avx(local_2c60,local_2b60);
      fVar114 = local_2c80._0_4_ * 1.1920929e-07;
      fVar124 = local_2c80._4_4_ * 1.1920929e-07;
      auVar53._4_4_ = fVar124;
      auVar53._0_4_ = fVar114;
      fVar125 = local_2c80._8_4_ * 1.1920929e-07;
      auVar53._8_4_ = fVar125;
      fVar126 = local_2c80._12_4_ * 1.1920929e-07;
      auVar53._12_4_ = fVar126;
      fVar127 = local_2c80._16_4_ * 1.1920929e-07;
      auVar53._16_4_ = fVar127;
      fVar128 = local_2c80._20_4_ * 1.1920929e-07;
      auVar53._20_4_ = fVar128;
      fVar129 = local_2c80._24_4_ * 1.1920929e-07;
      auVar53._24_4_ = fVar129;
      auVar53._28_4_ = 0x34000000;
      auVar134._0_4_ = (uint)fVar114 ^ local_2d40._0_4_;
      auVar134._4_4_ = (uint)fVar124 ^ local_2d40._4_4_;
      auVar134._8_4_ = (uint)fVar125 ^ local_2d40._8_4_;
      auVar134._12_4_ = (uint)fVar126 ^ local_2d40._12_4_;
      auVar134._16_4_ = (uint)fVar127 ^ local_2d40._16_4_;
      auVar134._20_4_ = (uint)fVar128 ^ local_2d40._20_4_;
      auVar134._24_4_ = (uint)fVar129 ^ local_2d40._24_4_;
      auVar134._28_4_ = local_2d40._28_4_ ^ 0x34000000;
      auVar136 = vcmpps_avx(auVar136,auVar134,5);
      local_2c40 = ZEXT1632(auVar19);
      auVar118 = vmaxps_avx(_local_2c20,ZEXT1632(auVar19));
      auVar118 = vmaxps_avx(auVar118,ZEXT1632(auVar21));
      auVar118 = vcmpps_avx(auVar118,auVar53,2);
      local_2e80 = vorps_avx(auVar136,auVar118);
      auVar136 = auVar105 & local_2e80;
      unaff_R12 = local_2e00._0_8_;
      local_2e60 = auVar105;
      _local_2dc0 = auVar29;
      _local_2da0 = auVar96;
      if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar136 >> 0x7f,0) == '\0') &&
            (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar136 >> 0xbf,0) == '\0') &&
          (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar136[0x1f]) {
LAB_015c3e68:
        local_2e80 = auVar140;
        auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                      CONCAT424(0x3f7ffffa,
                                                CONCAT420(0x3f7ffffa,
                                                          CONCAT416(0x3f7ffffa,
                                                                    CONCAT412(0x3f7ffffa,
                                                                              CONCAT48(0x3f7ffffa,
                                                                                                                                                                              
                                                  0x3f7ffffa3f7ffffa)))))));
        auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                      CONCAT424(0x3f800003,
                                                CONCAT420(0x3f800003,
                                                          CONCAT416(0x3f800003,
                                                                    CONCAT412(0x3f800003,
                                                                              CONCAT48(0x3f800003,
                                                                                                                                                                              
                                                  0x3f8000033f800003)))))));
      }
      else {
        auVar54._4_4_ = fVar165 * local_2ba0._4_4_;
        auVar54._0_4_ = fVar162 * local_2ba0._0_4_;
        auVar54._8_4_ = fVar166 * local_2ba0._8_4_;
        auVar54._12_4_ = fVar167 * local_2ba0._12_4_;
        auVar54._16_4_ = fVar168 * local_2ba0._16_4_;
        auVar54._20_4_ = fVar169 * local_2ba0._20_4_;
        auVar54._24_4_ = fVar170 * local_2ba0._24_4_;
        auVar54._28_4_ = local_2e80._28_4_;
        auVar55._4_4_ = fVar173 * local_2bc0._4_4_;
        auVar55._0_4_ = fVar171 * local_2bc0._0_4_;
        auVar55._8_4_ = fVar174 * local_2bc0._8_4_;
        auVar55._12_4_ = fVar175 * local_2bc0._12_4_;
        auVar55._16_4_ = fVar176 * local_2bc0._16_4_;
        auVar55._20_4_ = fVar177 * local_2bc0._20_4_;
        auVar55._24_4_ = fVar178 * local_2bc0._24_4_;
        auVar55._28_4_ = auVar118._28_4_;
        auVar21 = vfmsub213ps_fma(local_2bc0,local_2c00,auVar54);
        auVar56._4_4_ = fVar102 * auVar157._4_4_;
        auVar56._0_4_ = fVar101 * auVar157._0_4_;
        auVar56._8_4_ = fVar103 * auVar157._8_4_;
        auVar56._12_4_ = fVar15 * auVar157._12_4_;
        auVar56._16_4_ = fVar16 * auVar157._16_4_;
        auVar56._20_4_ = fVar17 * auVar157._20_4_;
        auVar56._24_4_ = fVar18 * auVar157._24_4_;
        auVar56._28_4_ = 0x34000000;
        auVar57._4_4_ = fVar173 * auVar141._4_4_;
        auVar57._0_4_ = fVar171 * auVar141._0_4_;
        auVar57._8_4_ = fVar174 * auVar141._8_4_;
        auVar57._12_4_ = fVar175 * auVar141._12_4_;
        auVar57._16_4_ = fVar176 * auVar141._16_4_;
        auVar57._20_4_ = fVar177 * auVar141._20_4_;
        auVar57._24_4_ = fVar178 * auVar141._24_4_;
        auVar57._28_4_ = auVar105._28_4_;
        auVar22 = vfmsub213ps_fma(auVar141,local_2be0,auVar56);
        auVar136 = vandps_avx(auVar54,local_2b60);
        auVar118 = vandps_avx(auVar56,local_2b60);
        auVar136 = vcmpps_avx(auVar136,auVar118,1);
        local_2ae0.field_0.x.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar22),ZEXT1632(auVar21),auVar136);
        auVar155 = ZEXT3264((undefined1  [32])local_2ae0.field_0.x.field_0);
        auVar58._4_4_ = auVar20._4_4_ * fVar165;
        auVar58._0_4_ = auVar20._0_4_ * fVar162;
        auVar58._8_4_ = auVar20._8_4_ * fVar166;
        auVar58._12_4_ = auVar20._12_4_ * fVar167;
        auVar58._16_4_ = auVar20._16_4_ * fVar168;
        auVar58._20_4_ = auVar20._20_4_ * fVar169;
        auVar58._24_4_ = auVar20._24_4_ * fVar170;
        auVar58._28_4_ = auVar136._28_4_;
        auVar21 = vfmsub213ps_fma(auVar20,local_2c00,auVar57);
        auVar59._4_4_ = fVar102 * local_2b80._4_4_;
        auVar59._0_4_ = fVar101 * local_2b80._0_4_;
        auVar59._8_4_ = fVar103 * local_2b80._8_4_;
        auVar59._12_4_ = fVar15 * local_2b80._12_4_;
        auVar59._16_4_ = fVar16 * local_2b80._16_4_;
        auVar59._20_4_ = fVar17 * local_2b80._20_4_;
        auVar59._24_4_ = fVar18 * local_2b80._24_4_;
        auVar59._28_4_ = auVar118._28_4_;
        auVar22 = vfmsub213ps_fma(local_2ba0,auVar160,auVar59);
        auVar136 = vandps_avx(auVar59,local_2b60);
        auVar118 = vandps_avx(auVar57,local_2b60);
        auVar136 = vcmpps_avx(auVar136,auVar118,1);
        local_2ae0.field_0.y.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar21),ZEXT1632(auVar22),auVar136);
        auVar148 = ZEXT3264((undefined1  [32])local_2ae0.field_0.y.field_0);
        auVar21 = vfmsub213ps_fma(local_2b80,local_2be0,auVar55);
        auVar22 = vfmsub213ps_fma(auVar157,auVar160,auVar58);
        auVar136 = vandps_avx(auVar55,local_2b60);
        auVar118 = vandps_avx(auVar58,local_2b60);
        auVar118 = vcmpps_avx(auVar136,auVar118,1);
        local_2ae0.field_0.z.field_0 =
             (vfloat_impl<8>)vblendvps_avx(ZEXT1632(auVar22),ZEXT1632(auVar21),auVar118);
        auVar142 = ZEXT3264((undefined1  [32])local_2ae0.field_0.z.field_0);
        local_2dc0._0_4_ = auVar75._0_4_;
        local_2dc0._4_4_ = auVar75._4_4_;
        fStack_2db8 = auVar75._8_4_;
        fStack_2db4 = auVar75._12_4_;
        fStack_2db0 = auVar75._16_4_;
        fStack_2dac = auVar75._20_4_;
        fStack_2da8 = auVar75._24_4_;
        auVar60._4_4_ = local_2ae0._68_4_ * (float)local_2dc0._4_4_;
        auVar60._0_4_ = local_2ae0._64_4_ * (float)local_2dc0._0_4_;
        auVar60._8_4_ = local_2ae0._72_4_ * fStack_2db8;
        auVar60._12_4_ = local_2ae0._76_4_ * fStack_2db4;
        auVar60._16_4_ = local_2ae0._80_4_ * fStack_2db0;
        auVar60._20_4_ = local_2ae0._84_4_ * fStack_2dac;
        auVar60._24_4_ = local_2ae0._88_4_ * fStack_2da8;
        auVar60._28_4_ = auVar118._28_4_;
        auVar21 = vfmadd213ps_fma(_local_2e20,(undefined1  [32])local_2ae0.field_0.y.field_0,auVar60
                                 );
        auVar21 = vfmadd213ps_fma(auVar117,(undefined1  [32])local_2ae0.field_0.x.field_0,
                                  ZEXT1632(auVar21));
        fVar114 = auVar21._0_4_ + auVar21._0_4_;
        fVar101 = auVar21._4_4_ + auVar21._4_4_;
        fVar102 = auVar21._8_4_ + auVar21._8_4_;
        fVar103 = auVar21._12_4_ + auVar21._12_4_;
        auVar118 = ZEXT1632(CONCAT412(fVar103,CONCAT48(fVar102,CONCAT44(fVar101,fVar114))));
        auVar61._4_4_ = local_2ae0._68_4_ * fVar9;
        auVar61._0_4_ = local_2ae0._64_4_ * fVar8;
        auVar61._8_4_ = local_2ae0._72_4_ * fVar10;
        auVar61._12_4_ = local_2ae0._76_4_ * fVar11;
        auVar61._16_4_ = local_2ae0._80_4_ * fVar12;
        auVar61._20_4_ = local_2ae0._84_4_ * fVar13;
        auVar61._24_4_ = local_2ae0._88_4_ * fVar14;
        auVar61._28_4_ = auVar136._28_4_;
        auVar21 = vfmadd213ps_fma(local_2ce0,(undefined1  [32])local_2ae0.field_0.y.field_0,auVar61)
        ;
        auVar22 = vfmadd213ps_fma(auVar96,(undefined1  [32])local_2ae0.field_0.x.field_0,
                                  ZEXT1632(auVar21));
        auVar117 = vrcpps_avx(auVar118);
        auVar139._8_4_ = 0x3f800000;
        auVar139._0_8_ = 0x3f8000003f800000;
        auVar139._12_4_ = 0x3f800000;
        auVar139._16_4_ = 0x3f800000;
        auVar139._20_4_ = 0x3f800000;
        auVar139._24_4_ = 0x3f800000;
        auVar139._28_4_ = 0x3f800000;
        auVar21 = vfnmadd213ps_fma(auVar117,auVar118,auVar139);
        auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar117,auVar117);
        local_2a80._28_4_ = auVar117._28_4_;
        local_2a80._0_28_ =
             ZEXT1628(CONCAT412((auVar22._12_4_ + auVar22._12_4_) * auVar21._12_4_,
                                CONCAT48((auVar22._8_4_ + auVar22._8_4_) * auVar21._8_4_,
                                         CONCAT44((auVar22._4_4_ + auVar22._4_4_) * auVar21._4_4_,
                                                  (auVar22._0_4_ + auVar22._0_4_) * auVar21._0_4_)))
                     );
        auVar117 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x60),local_2a80,2);
        auVar136 = vcmpps_avx(local_2a80,*(undefined1 (*) [32])(ray + 0x100),2);
        auVar117 = vandps_avx(auVar117,auVar136);
        auVar135._0_4_ = (uint)fVar114 ^ local_2d40._0_4_;
        auVar135._4_4_ = (uint)fVar101 ^ local_2d40._4_4_;
        auVar135._8_4_ = (uint)fVar102 ^ local_2d40._8_4_;
        auVar135._12_4_ = (uint)fVar103 ^ local_2d40._12_4_;
        auVar135._16_4_ = local_2d40._16_4_;
        auVar135._20_4_ = local_2d40._20_4_;
        auVar135._24_4_ = local_2d40._24_4_;
        auVar135._28_4_ = local_2d40._28_4_;
        auVar136 = vcmpps_avx(auVar118,auVar135,4);
        auVar117 = vandps_avx(auVar136,auVar117);
        auVar136 = vandps_avx(auVar105,local_2e80);
        auVar117 = vpslld_avx2(auVar117,0x1f);
        auVar118 = vpsrad_avx2(auVar117,0x1f);
        auVar117 = auVar136 & auVar118;
        auVar140 = local_2e80;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) goto LAB_015c3e68;
        auVar117 = vandps_avx(auVar118,auVar136);
        uVar3 = *(uint *)(local_2e00._0_8_ + lVar85 * 4);
        local_2da0._0_8_ = (context->scene->geometries).items[uVar3].ptr;
        uVar2 = ((Geometry *)local_2da0._0_8_)->mask;
        auVar109._4_4_ = uVar2;
        auVar109._0_4_ = uVar2;
        auVar109._8_4_ = uVar2;
        auVar109._12_4_ = uVar2;
        auVar109._16_4_ = uVar2;
        auVar109._20_4_ = uVar2;
        auVar109._24_4_ = uVar2;
        auVar109._28_4_ = uVar2;
        auVar136 = vpand_avx2(auVar109,*(undefined1 (*) [32])(ray + 0x120));
        auVar118 = vpcmpeqd_avx2(auVar136,_DAT_01f7b000);
        auVar136 = auVar117 & ~auVar118;
        if ((((((((auVar136 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar136 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar136 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar136 >> 0x7f,0) == '\0') &&
              (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar136 >> 0xbf,0) == '\0') &&
            (auVar136 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar136[0x1f]) goto LAB_015c3e68;
        local_2e20._0_4_ = *(undefined4 *)((long)&local_2cb0 + lVar85 * 4);
        auVar117 = vandnps_avx(auVar118,auVar117);
        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
           (((Geometry *)local_2da0._0_8_)->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
          auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                        CONCAT424(0x7f800000,
                                                  CONCAT420(0x7f800000,
                                                            CONCAT416(0x7f800000,
                                                                      CONCAT412(0x7f800000,
                                                                                CONCAT48(0x7f800000,
                                                                                                                                                                                  
                                                  0x7f8000007f800000)))))));
          auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                        CONCAT424(0x3f7ffffa,
                                                  CONCAT420(0x3f7ffffa,
                                                            CONCAT416(0x3f7ffffa,
                                                                      CONCAT412(0x3f7ffffa,
                                                                                CONCAT48(0x3f7ffffa,
                                                                                                                                                                                  
                                                  0x3f7ffffa3f7ffffa)))))));
          auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                        CONCAT424(0x3f800003,
                                                  CONCAT420(0x3f800003,
                                                            CONCAT416(0x3f800003,
                                                                      CONCAT412(0x3f800003,
                                                                                CONCAT48(0x3f800003,
                                                                                                                                                                                  
                                                  0x3f8000033f800003)))))));
        }
        else {
          local_2e80._0_8_ = lVar79;
          auVar105 = vrcpps_avx(local_2c60);
          auVar110._8_4_ = 0x3f800000;
          auVar110._0_8_ = 0x3f8000003f800000;
          auVar110._12_4_ = 0x3f800000;
          auVar110._16_4_ = 0x3f800000;
          auVar110._20_4_ = 0x3f800000;
          auVar110._24_4_ = 0x3f800000;
          auVar110._28_4_ = 0x3f800000;
          auVar21 = vfnmadd213ps_fma(local_2c60,auVar105,auVar110);
          auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar105,auVar105);
          auVar99._8_4_ = 0x219392ef;
          auVar99._0_8_ = 0x219392ef219392ef;
          auVar99._12_4_ = 0x219392ef;
          auVar99._16_4_ = 0x219392ef;
          auVar99._20_4_ = 0x219392ef;
          auVar99._24_4_ = 0x219392ef;
          auVar99._28_4_ = 0x219392ef;
          auVar105 = vcmpps_avx(local_2c80,auVar99,5);
          auVar105 = vandps_avx(auVar105,ZEXT1632(auVar21));
          auVar64._4_4_ = auVar105._4_4_ * auVar104._4_4_;
          auVar64._0_4_ = auVar105._0_4_ * auVar104._0_4_;
          auVar64._8_4_ = auVar105._8_4_ * auVar104._8_4_;
          auVar64._12_4_ = auVar105._12_4_ * auVar104._12_4_;
          auVar64._16_4_ = auVar105._16_4_ * 0.0;
          auVar64._20_4_ = auVar105._20_4_ * 0.0;
          auVar64._24_4_ = auVar105._24_4_ * 0.0;
          auVar64._28_4_ = local_2c80._28_4_;
          auVar136 = vminps_avx(auVar64,auVar110);
          auVar65._4_4_ = auVar105._4_4_ * auVar19._4_4_;
          auVar65._0_4_ = auVar105._0_4_ * auVar19._0_4_;
          auVar65._8_4_ = auVar105._8_4_ * auVar19._8_4_;
          auVar65._12_4_ = auVar105._12_4_ * auVar19._12_4_;
          auVar65._16_4_ = auVar105._16_4_ * 0.0;
          auVar65._20_4_ = auVar105._20_4_ * 0.0;
          auVar65._24_4_ = auVar105._24_4_ * 0.0;
          auVar65._28_4_ = auVar105._28_4_;
          auVar105 = vminps_avx(auVar65,auVar110);
          auVar118 = vsubps_avx(auVar110,auVar136);
          auVar140 = vsubps_avx(auVar110,auVar105);
          auVar70._8_8_ = uStack_2778;
          auVar70._0_8_ = local_2780;
          auVar70._16_8_ = uStack_2770;
          auVar70._24_8_ = uStack_2768;
          local_2a40 = vblendvps_avx(auVar136,auVar118,auVar70);
          local_2a60 = vblendvps_avx(auVar105,auVar140,auVar70);
          local_2eb0.valid = local_29c0;
          local_2eb0.geometryUserPtr = &local_2b40;
          local_2eb0.context = local_2b20;
          local_2eb0.ray = local_2b00;
          stack0xffffffffffffd268 = auVar96._8_24_;
          auVar142 = ZEXT1664(local_2ae0._64_16_);
          auVar148 = ZEXT1664(local_2ae0._32_16_);
          auVar155 = ZEXT1664(local_2ae0._0_16_);
          local_2d40 = auVar117;
          std::
          _Tuple_impl<0ul,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::vfloat_impl<8>&,embree::Vec3<embree::vfloat_impl<8>>&>
          ::
          _M_assign<embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::vfloat_impl<8>,embree::Vec3<embree::vfloat_impl<8>>>
                    ((_Tuple_impl<0UL,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::vfloat_impl<8>_&,_embree::Vec3<embree::vfloat_impl<8>_>_&>
                      *)&local_2eb0,
                     (_Tuple_impl<0UL,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::vfloat_impl<8>,_embree::Vec3<embree::vfloat_impl<8>_>_>
                      *)&local_2ae0.field_0);
          pRVar6 = context->user;
          local_2a40._4_4_ = local_2e20._0_4_;
          local_2a40._0_4_ = local_2e20._0_4_;
          local_2a40._8_4_ = local_2e20._0_4_;
          local_2a40._12_4_ = local_2e20._0_4_;
          local_2a40._16_4_ = local_2e20._0_4_;
          local_2a40._20_4_ = local_2e20._0_4_;
          local_2a40._24_4_ = local_2e20._0_4_;
          local_2a40._28_4_ = local_2e20._0_4_;
          local_2a20 = uVar3;
          uStack_2a1c = uVar3;
          uStack_2a18 = uVar3;
          uStack_2a14 = uVar3;
          uStack_2a10 = uVar3;
          uStack_2a0c = uVar3;
          uStack_2a08 = uVar3;
          uStack_2a04 = uVar3;
          auVar136 = vpcmpeqd_avx2(local_2a40,local_2a40);
          local_2dc8[1] = auVar136;
          *local_2dc8 = auVar136;
          local_2a00 = pRVar6->instID[0];
          uStack_29fc = local_2a00;
          uStack_29f8 = local_2a00;
          uStack_29f4 = local_2a00;
          uStack_29f0 = local_2a00;
          uStack_29ec = local_2a00;
          uStack_29e8 = local_2a00;
          uStack_29e4 = local_2a00;
          local_29e0 = pRVar6->instPrimID[0];
          uStack_29dc = local_29e0;
          uStack_29d8 = local_29e0;
          uStack_29d4 = local_29e0;
          uStack_29d0 = local_29e0;
          uStack_29cc = local_29e0;
          uStack_29c8 = local_29e0;
          uStack_29c4 = local_29e0;
          auVar105 = *(undefined1 (*) [32])(ray + 0x100);
          auVar117 = vblendvps_avx(auVar105,(undefined1  [32])local_2b40,local_2d40);
          *(undefined1 (*) [32])(ray + 0x100) = auVar117;
          local_2d80 = local_2d40;
          local_2eb0.valid = (int *)local_2d80;
          local_2eb0.geometryUserPtr = *(void **)(local_2da0._0_8_ + 0x18);
          local_2eb0.context = context->user;
          local_2eb0.hit = (RTCHitN *)&local_2ae0;
          local_2eb0.N = 8;
          local_2eb0.ray = (RTCRayN *)ray;
          if (*(code **)(local_2da0._0_8_ + 0x48) != (code *)0x0) {
            auVar142 = ZEXT1664(auVar142._0_16_);
            auVar148 = ZEXT1664(auVar148._0_16_);
            auVar155 = ZEXT1664(auVar155._0_16_);
            _local_2e20 = auVar105;
            (**(code **)(local_2da0._0_8_ + 0x48))(&local_2eb0);
            auVar161._8_56_ = extraout_var_00;
            auVar161._0_8_ = extraout_XMM1_Qa_00;
            auVar136 = vpcmpeqd_avx2(auVar161._0_32_,auVar161._0_32_);
            auVar105 = _local_2e20;
          }
          auVar117 = vpcmpeqd_avx2(local_2d80,_DAT_01f7b000);
          auVar118 = auVar136 & ~auVar117;
          unaff_R12 = local_2e00._0_8_;
          if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar118 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar118 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar118 >> 0x7f,0) == '\0') &&
                (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar118 >> 0xbf,0) == '\0') &&
              (auVar118 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar118[0x1f]) {
            auVar117 = auVar117 ^ auVar136;
            auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                          CONCAT424(0x7f800000,
                                                    CONCAT420(0x7f800000,
                                                              CONCAT416(0x7f800000,
                                                                        CONCAT412(0x7f800000,
                                                                                  CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
            auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                          CONCAT424(0x3f7ffffa,
                                                    CONCAT420(0x3f7ffffa,
                                                              CONCAT416(0x3f7ffffa,
                                                                        CONCAT412(0x3f7ffffa,
                                                                                  CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
            auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                          CONCAT424(0x3f800003,
                                                    CONCAT420(0x3f800003,
                                                              CONCAT416(0x3f800003,
                                                                        CONCAT412(0x3f800003,
                                                                                  CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            lVar79 = local_2e80._0_8_;
          }
          else {
            p_Var7 = context->args->filter;
            if (p_Var7 == (RTCFilterFunctionN)0x0) {
              auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
            }
            else {
              auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                            CONCAT424(0x3f7ffffa,
                                                      CONCAT420(0x3f7ffffa,
                                                                CONCAT416(0x3f7ffffa,
                                                                          CONCAT412(0x3f7ffffa,
                                                                                    CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
              auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                            CONCAT424(0x3f800003,
                                                      CONCAT420(0x3f800003,
                                                                CONCAT416(0x3f800003,
                                                                          CONCAT412(0x3f800003,
                                                                                    CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
              if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                   RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                 ((*(byte *)(local_2da0._0_8_ + 0x3e) & 0x40) != 0)) {
                auVar142 = ZEXT1664(auVar142._0_16_);
                auVar148 = ZEXT1664(auVar148._0_16_);
                auVar155 = ZEXT1664(auVar155._0_16_);
                _local_2e20 = auVar105;
                (*p_Var7)(&local_2eb0);
                auVar172 = ZEXT3264(CONCAT428(0x3f800003,
                                              CONCAT424(0x3f800003,
                                                        CONCAT420(0x3f800003,
                                                                  CONCAT416(0x3f800003,
                                                                            CONCAT412(0x3f800003,
                                                                                      CONCAT48(
                                                  0x3f800003,0x3f8000033f800003)))))));
                auVar161 = ZEXT3264(CONCAT428(0x3f7ffffa,
                                              CONCAT424(0x3f7ffffa,
                                                        CONCAT420(0x3f7ffffa,
                                                                  CONCAT416(0x3f7ffffa,
                                                                            CONCAT412(0x3f7ffffa,
                                                                                      CONCAT48(
                                                  0x3f7ffffa,0x3f7ffffa3f7ffffa)))))));
                auVar159 = ZEXT3264(CONCAT428(0x7f800000,
                                              CONCAT424(0x7f800000,
                                                        CONCAT420(0x7f800000,
                                                                  CONCAT416(0x7f800000,
                                                                            CONCAT412(0x7f800000,
                                                                                      CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                auVar105 = _local_2e20;
              }
            }
            auVar136 = vpcmpeqd_avx2(local_2d80,_DAT_01f7b000);
            auVar117 = auVar136 ^ _DAT_01f7b020;
            auVar112._8_4_ = 0xff800000;
            auVar112._0_8_ = 0xff800000ff800000;
            auVar112._12_4_ = 0xff800000;
            auVar112._16_4_ = 0xff800000;
            auVar112._20_4_ = 0xff800000;
            auVar112._24_4_ = 0xff800000;
            auVar112._28_4_ = 0xff800000;
            auVar136 = vblendvps_avx(auVar112,*(undefined1 (*) [32])(local_2eb0.ray + 0x100),
                                     auVar136);
            *(undefined1 (*) [32])(local_2eb0.ray + 0x100) = auVar136;
            lVar79 = local_2e80._0_8_;
          }
          auVar105 = vblendvps_avx(auVar105,*(undefined1 (*) [32])local_2e28,auVar117);
          *(undefined1 (*) [32])local_2e28 = auVar105;
        }
        auVar105 = vandnps_avx(auVar117,local_2e60);
        auVar117 = local_2e60 & ~auVar117;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) break;
      }
    }
    auVar117 = local_2ca0;
    auVar123 = ZEXT3264(local_2ca0);
    auVar136 = vandps_avx(auVar105,local_2ca0);
    lVar78 = local_2d50 + 1;
    unaff_R12 = unaff_R12 + 0xe0;
    auVar105 = local_2ca0 & auVar105;
    local_2ca0 = auVar136;
  } while ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              SUB321(auVar105 >> 0x7f,0) != '\0') ||
             (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            SUB321(auVar105 >> 0xbf,0) != '\0') ||
           (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           auVar105[0x1f] < '\0');
  auVar117 = vpcmpeqd_avx2(auVar117,auVar117);
  auVar100._0_4_ = local_2ca0._0_4_ ^ auVar117._0_4_;
  auVar100._4_4_ = local_2ca0._4_4_ ^ auVar117._4_4_;
  auVar100._8_4_ = local_2ca0._8_4_ ^ auVar117._8_4_;
  auVar100._12_4_ = local_2ca0._12_4_ ^ auVar117._12_4_;
  auVar100._16_4_ = local_2ca0._16_4_ ^ auVar117._16_4_;
  auVar100._20_4_ = local_2ca0._20_4_ ^ auVar117._20_4_;
  auVar100._24_4_ = local_2ca0._24_4_ ^ auVar117._24_4_;
  auVar100._28_4_ = local_2ca0._28_4_ ^ auVar117._28_4_;
  local_2d20 = vorps_avx(auVar100,local_2d20);
  auVar117 = auVar117 & ~local_2d20;
  if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0x7f,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar117 >> 0xbf,0) == '\0') &&
      (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
  goto LAB_015c4887;
  auVar122._8_4_ = 0xff800000;
  auVar122._0_8_ = 0xff800000ff800000;
  auVar122._12_4_ = 0xff800000;
  auVar122._16_4_ = 0xff800000;
  auVar122._20_4_ = 0xff800000;
  auVar122._24_4_ = 0xff800000;
  auVar122._28_4_ = 0xff800000;
  auVar123 = ZEXT3264(auVar122);
  local_27c0 = vblendvps_avx(local_27c0,auVar122,local_2d20);
  goto LAB_015c327d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }